

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNvIntersectorK<8,4>::
intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
          (CurveNvIntersectorK<8,4> *this,Precalculations *pre,RayHitK<4> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  Vector *pVVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [12];
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  byte bVar57;
  byte bVar58;
  ulong uVar59;
  ulong uVar60;
  byte bVar61;
  byte bVar62;
  long lVar63;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  bool bVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar128;
  uint uVar129;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar130;
  uint uVar134;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float pp;
  float fVar135;
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar149;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar150;
  float fVar151;
  undefined4 uVar152;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar161 [16];
  undefined1 auVar165 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar211 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [32];
  undefined4 uVar231;
  undefined4 uVar232;
  undefined1 auVar230 [64];
  undefined4 uVar233;
  undefined1 auVar234 [28];
  undefined1 auVar235 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  float fVar242;
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_8b0 [16];
  int local_894;
  uint local_890;
  uint local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 *local_820;
  undefined8 local_818;
  undefined8 local_810;
  Precalculations *local_808;
  int *local_800;
  undefined4 local_7f8;
  undefined1 local_7f0 [16];
  long local_7d8;
  RayQueryContext *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  bVar57 = *(byte *)((long)&context->scene + 1);
  uVar67 = (ulong)bVar57;
  lVar63 = (long)context + uVar67 * 0x19 + 0x16;
  fVar242 = *(float *)((long)context + uVar67 * 0x19 + 0x12);
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x10)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)pre->ray_space[0].vy.field_0.m128[(long)ray]),0x20);
  auVar72 = vinsertps_avx(ZEXT416((uint)pre->ray_space[1].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x10);
  auVar78 = vinsertps_avx(auVar72,ZEXT416((uint)pre->ray_space[1].vz.field_0.m128[(long)ray]),0x20);
  auVar77 = vsubps_avx(auVar71,*(undefined1 (*) [16])((long)context + uVar67 * 0x19 + 6));
  fVar199 = fVar242 * auVar77._0_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 4 + 6);
  auVar85 = vpmovsxbd_avx2(auVar71);
  fVar135 = fVar242 * auVar78._0_4_;
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 5 + 6);
  auVar83 = vpmovsxbd_avx2(auVar72);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar74);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 0xc + 6);
  auVar88 = vpmovsxbd_avx2(auVar69);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 0xd + 6);
  auVar84 = vpmovsxbd_avx2(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 0x12 + 6);
  auVar89 = vpmovsxbd_avx2(auVar76);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 0x13 + 6);
  auVar90 = vpmovsxbd_avx2(auVar70);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)((long)&context->scene + uVar67 * 0x14 + 6);
  auVar92 = vpmovsxbd_avx2(auVar79);
  auVar91 = vcvtdq2ps_avx(auVar92);
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  auVar101._4_4_ = fVar135;
  auVar101._0_4_ = fVar135;
  auVar101._8_4_ = fVar135;
  auVar101._12_4_ = fVar135;
  auVar101._16_4_ = fVar135;
  auVar101._20_4_ = fVar135;
  auVar101._24_4_ = fVar135;
  auVar101._28_4_ = fVar135;
  auVar82 = ZEXT1632(CONCAT412(fVar242 * auVar78._12_4_,
                               CONCAT48(fVar242 * auVar78._8_4_,
                                        CONCAT44(fVar242 * auVar78._4_4_,fVar135))));
  auVar93 = vpermps_avx2(auVar103,auVar82);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar81 = vpermps_avx512vl(auVar80,auVar82);
  fVar135 = auVar81._0_4_;
  auVar212._0_4_ = fVar135 * auVar86._0_4_;
  fVar149 = auVar81._4_4_;
  auVar212._4_4_ = fVar149 * auVar86._4_4_;
  fVar150 = auVar81._8_4_;
  auVar212._8_4_ = fVar150 * auVar86._8_4_;
  fVar166 = auVar81._12_4_;
  auVar212._12_4_ = fVar166 * auVar86._12_4_;
  fVar168 = auVar81._16_4_;
  auVar212._16_4_ = fVar168 * auVar86._16_4_;
  fVar170 = auVar81._20_4_;
  auVar212._20_4_ = fVar170 * auVar86._20_4_;
  fVar136 = auVar81._24_4_;
  auVar212._28_36_ = in_ZMM4._28_36_;
  auVar212._24_4_ = fVar136 * auVar86._24_4_;
  auVar82._4_4_ = auVar84._4_4_ * fVar149;
  auVar82._0_4_ = auVar84._0_4_ * fVar135;
  auVar82._8_4_ = auVar84._8_4_ * fVar150;
  auVar82._12_4_ = auVar84._12_4_ * fVar166;
  auVar82._16_4_ = auVar84._16_4_ * fVar168;
  auVar82._20_4_ = auVar84._20_4_ * fVar170;
  auVar82._24_4_ = auVar84._24_4_ * fVar136;
  auVar82._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = fVar149 * auVar91._4_4_;
  auVar92._0_4_ = fVar135 * auVar91._0_4_;
  auVar92._8_4_ = fVar150 * auVar91._8_4_;
  auVar92._12_4_ = fVar166 * auVar91._12_4_;
  auVar92._16_4_ = fVar168 * auVar91._16_4_;
  auVar92._20_4_ = fVar170 * auVar91._20_4_;
  auVar92._24_4_ = fVar136 * auVar91._24_4_;
  auVar92._28_4_ = auVar81._28_4_;
  auVar71 = vfmadd231ps_fma(auVar212._0_32_,auVar93,auVar83);
  auVar72 = vfmadd231ps_fma(auVar82,auVar93,auVar88);
  auVar73 = vfmadd231ps_fma(auVar92,auVar90,auVar93);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar101,auVar85);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar101,auVar87);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar89,auVar101);
  auVar102._4_4_ = fVar199;
  auVar102._0_4_ = fVar199;
  auVar102._8_4_ = fVar199;
  auVar102._12_4_ = fVar199;
  auVar102._16_4_ = fVar199;
  auVar102._20_4_ = fVar199;
  auVar102._24_4_ = fVar199;
  auVar102._28_4_ = fVar199;
  auVar93 = ZEXT1632(CONCAT412(fVar242 * auVar77._12_4_,
                               CONCAT48(fVar242 * auVar77._8_4_,
                                        CONCAT44(fVar242 * auVar77._4_4_,fVar199))));
  auVar92 = vpermps_avx2(auVar103,auVar93);
  auVar82 = vpermps_avx512vl(auVar80,auVar93);
  fVar242 = auVar82._0_4_;
  fVar135 = auVar82._4_4_;
  auVar93._4_4_ = fVar135 * auVar86._4_4_;
  auVar93._0_4_ = fVar242 * auVar86._0_4_;
  fVar149 = auVar82._8_4_;
  auVar93._8_4_ = fVar149 * auVar86._8_4_;
  fVar150 = auVar82._12_4_;
  auVar93._12_4_ = fVar150 * auVar86._12_4_;
  fVar166 = auVar82._16_4_;
  auVar93._16_4_ = fVar166 * auVar86._16_4_;
  fVar168 = auVar82._20_4_;
  auVar93._20_4_ = fVar168 * auVar86._20_4_;
  fVar170 = auVar82._24_4_;
  auVar93._24_4_ = fVar170 * auVar86._24_4_;
  auVar93._28_4_ = auVar86._28_4_;
  auVar96._0_4_ = fVar242 * auVar84._0_4_;
  auVar96._4_4_ = fVar135 * auVar84._4_4_;
  auVar96._8_4_ = fVar149 * auVar84._8_4_;
  auVar96._12_4_ = fVar150 * auVar84._12_4_;
  auVar96._16_4_ = fVar166 * auVar84._16_4_;
  auVar96._20_4_ = fVar168 * auVar84._20_4_;
  auVar96._24_4_ = fVar170 * auVar84._24_4_;
  auVar96._28_4_ = 0;
  auVar84._4_4_ = fVar135 * auVar91._4_4_;
  auVar84._0_4_ = fVar242 * auVar91._0_4_;
  auVar84._8_4_ = fVar149 * auVar91._8_4_;
  auVar84._12_4_ = fVar150 * auVar91._12_4_;
  auVar84._16_4_ = fVar166 * auVar91._16_4_;
  auVar84._20_4_ = fVar168 * auVar91._20_4_;
  auVar84._24_4_ = fVar170 * auVar91._24_4_;
  auVar84._28_4_ = auVar91._28_4_;
  auVar74 = vfmadd231ps_fma(auVar93,auVar92,auVar83);
  auVar69 = vfmadd231ps_fma(auVar96,auVar92,auVar88);
  auVar75 = vfmadd231ps_fma(auVar84,auVar92,auVar90);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar102,auVar85);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar102,auVar87);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar102,auVar89);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar71),auVar98);
  uVar59 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar64 = (bool)((byte)uVar59 & 1);
  auVar80._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._0_4_;
  bVar64 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._4_4_;
  bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._8_4_;
  bVar64 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar72),auVar98);
  uVar59 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar64 = (bool)((byte)uVar59 & 1);
  auVar81._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._0_4_;
  bVar64 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._4_4_;
  bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._8_4_;
  bVar64 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar73),auVar98);
  uVar59 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar64 = (bool)((byte)uVar59 & 1);
  auVar85._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar73._0_4_;
  bVar64 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar73._4_4_;
  bVar64 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar73._8_4_;
  bVar64 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar73._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar99._16_4_ = 0x3f800000;
  auVar99._20_4_ = 0x3f800000;
  auVar99._24_4_ = 0x3f800000;
  auVar99._28_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar80,auVar83,auVar99);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar72 = vfnmadd213ps_fma(auVar81,auVar83,auVar99);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar85);
  auVar73 = vfnmadd213ps_fma(auVar85,auVar83,auVar99);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar83,auVar83);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar67 * 7 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar74));
  auVar89._4_4_ = auVar71._4_4_ * auVar85._4_4_;
  auVar89._0_4_ = auVar71._0_4_ * auVar85._0_4_;
  auVar89._8_4_ = auVar71._8_4_ * auVar85._8_4_;
  auVar89._12_4_ = auVar71._12_4_ * auVar85._12_4_;
  auVar89._16_4_ = auVar85._16_4_ * 0.0;
  auVar89._20_4_ = auVar85._20_4_ * 0.0;
  auVar89._24_4_ = auVar85._24_4_ * 0.0;
  auVar89._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar67 * 9 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar74));
  auVar97._0_4_ = auVar71._0_4_ * auVar85._0_4_;
  auVar97._4_4_ = auVar71._4_4_ * auVar85._4_4_;
  auVar97._8_4_ = auVar71._8_4_ * auVar85._8_4_;
  auVar97._12_4_ = auVar71._12_4_ * auVar85._12_4_;
  auVar97._16_4_ = auVar85._16_4_ * 0.0;
  auVar97._20_4_ = auVar85._20_4_ * 0.0;
  auVar97._24_4_ = auVar85._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar67 * 0xe + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar90._4_4_ = auVar72._4_4_ * auVar85._4_4_;
  auVar90._0_4_ = auVar72._0_4_ * auVar85._0_4_;
  auVar90._8_4_ = auVar72._8_4_ * auVar85._8_4_;
  auVar90._12_4_ = auVar72._12_4_ * auVar85._12_4_;
  auVar90._16_4_ = auVar85._16_4_ * 0.0;
  auVar90._20_4_ = auVar85._20_4_ * 0.0;
  auVar90._24_4_ = auVar85._24_4_ * 0.0;
  auVar90._28_4_ = auVar85._28_4_;
  auVar84 = vpbroadcastd_avx512vl();
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar57 * 0x10 + 6))
  ;
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar67 * 0x15 + 6));
  auVar95._0_4_ = auVar72._0_4_ * auVar85._0_4_;
  auVar95._4_4_ = auVar72._4_4_ * auVar85._4_4_;
  auVar95._8_4_ = auVar72._8_4_ * auVar85._8_4_;
  auVar95._12_4_ = auVar72._12_4_ * auVar85._12_4_;
  auVar95._16_4_ = auVar85._16_4_ * 0.0;
  auVar95._20_4_ = auVar85._20_4_ * 0.0;
  auVar95._24_4_ = auVar85._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar85 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar75));
  auVar91._4_4_ = auVar85._4_4_ * auVar73._4_4_;
  auVar91._0_4_ = auVar85._0_4_ * auVar73._0_4_;
  auVar91._8_4_ = auVar85._8_4_ * auVar73._8_4_;
  auVar91._12_4_ = auVar85._12_4_ * auVar73._12_4_;
  auVar91._16_4_ = auVar85._16_4_ * 0.0;
  auVar91._20_4_ = auVar85._20_4_ * 0.0;
  auVar91._24_4_ = auVar85._24_4_ * 0.0;
  auVar91._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar67 * 0x17 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar75));
  auVar94._0_4_ = auVar73._0_4_ * auVar85._0_4_;
  auVar94._4_4_ = auVar73._4_4_ * auVar85._4_4_;
  auVar94._8_4_ = auVar73._8_4_ * auVar85._8_4_;
  auVar94._12_4_ = auVar73._12_4_ * auVar85._12_4_;
  auVar94._16_4_ = auVar85._16_4_ * 0.0;
  auVar94._20_4_ = auVar85._20_4_ * 0.0;
  auVar94._24_4_ = auVar85._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar85 = vpminsd_avx2(auVar89,auVar97);
  auVar83 = vpminsd_avx2(auVar90,auVar95);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83 = vpminsd_avx2(auVar91,auVar94);
  uVar152 = *(undefined4 *)((long)&pre->ray_space[0].vz.field_0 + (long)ray * 4);
  auVar86._4_4_ = uVar152;
  auVar86._0_4_ = uVar152;
  auVar86._8_4_ = uVar152;
  auVar86._12_4_ = uVar152;
  auVar86._16_4_ = uVar152;
  auVar86._20_4_ = uVar152;
  auVar86._24_4_ = uVar152;
  auVar86._28_4_ = uVar152;
  auVar83 = vmaxps_avx512vl(auVar83,auVar86);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  auVar83._16_4_ = 0x3f7ffffa;
  auVar83._20_4_ = 0x3f7ffffa;
  auVar83._24_4_ = 0x3f7ffffa;
  auVar83._28_4_ = 0x3f7ffffa;
  local_260 = vmulps_avx512vl(auVar85,auVar83);
  auVar85 = vpmaxsd_avx2(auVar89,auVar97);
  auVar83 = vpmaxsd_avx2(auVar90,auVar95);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar83 = vpmaxsd_avx2(auVar91,auVar94);
  uVar152 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
  auVar87._4_4_ = uVar152;
  auVar87._0_4_ = uVar152;
  auVar87._8_4_ = uVar152;
  auVar87._12_4_ = uVar152;
  auVar87._16_4_ = uVar152;
  auVar87._20_4_ = uVar152;
  auVar87._24_4_ = uVar152;
  auVar87._28_4_ = uVar152;
  auVar83 = vminps_avx512vl(auVar83,auVar87);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar88);
  uVar15 = vcmpps_avx512vl(local_260,auVar85,2);
  uVar17 = vpcmpgtd_avx512vl(auVar84,_DAT_01fb4ba0);
  local_7c8 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar17));
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_7d8 = lVar63;
  local_7d0 = context;
LAB_0199e321:
  local_894 = 1;
  if (local_7c8 == 0) {
    return;
  }
  lVar18 = 0;
  for (uVar59 = local_7c8; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  local_7c8 = local_7c8 - 1 & local_7c8;
  fVar242 = *(float *)((long)&context->scene + lVar18 * 4 + 6);
  uVar59 = (ulong)(uint)((int)lVar18 << 6);
  auVar71 = *(undefined1 (*) [16])(lVar63 + uVar59);
  if (local_7c8 != 0) {
    uVar60 = local_7c8 - 1 & local_7c8;
    for (uVar67 = local_7c8; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar60 != 0) {
      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar72 = *(undefined1 (*) [16])(lVar63 + 0x10 + uVar59);
  auVar73 = *(undefined1 (*) [16])(lVar63 + 0x20 + uVar59);
  auVar74 = *(undefined1 (*) [16])(lVar63 + 0x30 + uVar59);
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x10)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar75 = vinsertps_avx(auVar69,ZEXT416((uint)pre->ray_space[0].vy.field_0.m128[(long)ray]),0x28);
  local_380 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[1].vx.field_0.m128[(long)ray]));
  local_3a0 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]));
  auVar69 = vunpcklps_avx512vl(local_380._0_16_,local_3a0._0_16_);
  _local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[1].vz.field_0.m128[(long)ray]));
  auVar79 = local_3c0._0_16_;
  local_690 = vinsertps_avx512f(auVar69,auVar79,0x28);
  auVar77._0_4_ = auVar71._0_4_ + auVar72._0_4_ + auVar73._0_4_ + auVar74._0_4_;
  auVar77._4_4_ = auVar71._4_4_ + auVar72._4_4_ + auVar73._4_4_ + auVar74._4_4_;
  auVar77._8_4_ = auVar71._8_4_ + auVar72._8_4_ + auVar73._8_4_ + auVar74._8_4_;
  auVar77._12_4_ = auVar71._12_4_ + auVar72._12_4_ + auVar73._12_4_ + auVar74._12_4_;
  auVar78._8_4_ = 0x3e800000;
  auVar78._0_8_ = 0x3e8000003e800000;
  auVar78._12_4_ = 0x3e800000;
  auVar69 = vmulps_avx512vl(auVar77,auVar78);
  auVar69 = vsubps_avx(auVar69,auVar75);
  auVar69 = vdpps_avx(auVar69,local_690,0x7f);
  fVar149 = *(float *)((long)&context->scene + 2);
  local_6a0 = vdpps_avx(local_690,local_690,0x7f);
  fVar135 = pre->ray_space[0].vz.field_0.m128[(long)ray];
  auVar219._4_12_ = ZEXT812(0) << 0x20;
  auVar219._0_4_ = local_6a0._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
  auVar76 = vfnmadd213ss_fma(auVar70,local_6a0,ZEXT416(0x40000000));
  local_240 = auVar69._0_4_ * auVar70._0_4_ * auVar76._0_4_;
  auVar220._4_4_ = local_240;
  auVar220._0_4_ = local_240;
  auVar220._8_4_ = local_240;
  auVar220._12_4_ = local_240;
  fStack_670 = local_240;
  _local_680 = auVar220;
  fStack_66c = local_240;
  fStack_668 = local_240;
  fStack_664 = local_240;
  auVar69 = vfmadd231ps_fma(auVar75,local_690,auVar220);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar71 = vsubps_avx(auVar71,auVar69);
  auVar73 = vsubps_avx(auVar73,auVar69);
  auVar72 = vsubps_avx(auVar72,auVar69);
  auVar74 = vsubps_avx(auVar74,auVar69);
  local_740 = vbroadcastss_avx512vl(auVar71);
  auVar244 = ZEXT3264(local_740);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  local_560 = ZEXT1632(auVar71);
  local_760 = vpermps_avx512vl(auVar105,local_560);
  auVar245 = ZEXT3264(local_760);
  auVar106._8_4_ = 2;
  auVar106._0_8_ = 0x200000002;
  auVar106._12_4_ = 2;
  auVar106._16_4_ = 2;
  auVar106._20_4_ = 2;
  auVar106._24_4_ = 2;
  auVar106._28_4_ = 2;
  local_780 = vpermps_avx2(auVar106,local_560);
  auVar239 = ZEXT3264(local_780);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  local_700 = vpermps_avx2(auVar107,local_560);
  uVar152 = auVar72._0_4_;
  local_720._4_4_ = uVar152;
  local_720._0_4_ = uVar152;
  local_720._8_4_ = uVar152;
  local_720._12_4_ = uVar152;
  local_720._16_4_ = uVar152;
  local_720._20_4_ = uVar152;
  local_720._24_4_ = uVar152;
  local_720._28_4_ = uVar152;
  auVar225 = ZEXT3264(local_720);
  local_5a0 = ZEXT1632(auVar72);
  local_7a0 = vpermps_avx2(auVar105,local_5a0);
  local_7c0 = vpermps_avx2(auVar106,local_5a0);
  auVar243 = ZEXT3264(local_7c0);
  auVar85 = vpermps_avx512vl(auVar107,local_5a0);
  auVar230 = ZEXT3264(local_7a0);
  auVar83 = vbroadcastss_avx512vl(auVar73);
  local_580 = ZEXT1632(auVar73);
  auVar86 = vpermps_avx512vl(auVar105,local_580);
  auVar87 = vpermps_avx512vl(auVar106,local_580);
  auVar88 = vpermps_avx512vl(auVar107,local_580);
  auVar228 = ZEXT3264(local_700);
  auVar84 = vbroadcastss_avx512vl(auVar74);
  _local_5c0 = ZEXT1632(auVar74);
  auVar89 = vpermps_avx512vl(auVar105,_local_5c0);
  auVar90 = vpermps_avx512vl(auVar106,_local_5c0);
  auVar91 = vpermps_avx512vl(auVar107,_local_5c0);
  auVar71 = vmulss_avx512f(auVar79,auVar79);
  auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),local_3a0,local_3a0);
  auVar92 = vfmadd231ps_avx512vl(auVar92,local_380,local_380);
  auVar92 = vbroadcastss_avx512vl(auVar92._0_16_);
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar92,auVar104);
  local_220 = auVar92;
  local_610 = ZEXT416((uint)local_240);
  local_240 = fVar135 - local_240;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  local_470 = vpbroadcastd_avx512vl();
  uVar59 = 0;
  local_480 = vpbroadcastd_avx512vl();
  auVar71 = vsqrtss_avx(local_6a0,local_6a0);
  local_884 = auVar71._0_4_;
  auVar71 = vsqrtss_avx(local_6a0,local_6a0);
  local_888 = auVar71._0_4_;
  auVar235 = ZEXT3264(local_7c0);
  local_2f0 = ZEXT816(0x3f80000000000000);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar247 = ZEXT3264(auVar93);
  auVar212 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar71 = vmovshdup_avx(local_2f0);
    auVar71 = vsubps_avx(auVar71,local_2f0);
    fVar199 = auVar71._0_4_;
    fVar136 = fVar199 * 0.04761905;
    local_860._0_4_ = local_2f0._0_4_;
    local_860._4_4_ = local_860._0_4_;
    fStack_858 = (float)local_860._0_4_;
    fStack_854 = (float)local_860._0_4_;
    register0x00001290 = local_860._0_4_;
    register0x00001294 = local_860._0_4_;
    register0x00001298 = local_860._0_4_;
    register0x0000129c = local_860._0_4_;
    local_6c0._4_4_ = fVar199;
    local_6c0._0_4_ = fVar199;
    fStack_6b8 = fVar199;
    fStack_6b4 = fVar199;
    register0x000012d0 = fVar199;
    register0x000012d4 = fVar199;
    register0x000012d8 = fVar199;
    register0x000012dc = fVar199;
    auVar71 = vfmadd231ps_fma(_local_860,_local_6c0,auVar212._0_32_);
    auVar246 = auVar247._0_32_;
    auVar93 = vsubps_avx512vl(auVar246,ZEXT1632(auVar71));
    fVar150 = auVar71._0_4_;
    fVar166 = auVar71._4_4_;
    auVar211._4_4_ = auVar225._4_4_ * fVar166;
    auVar211._0_4_ = auVar225._0_4_ * fVar150;
    fVar168 = auVar71._8_4_;
    auVar211._8_4_ = auVar225._8_4_ * fVar168;
    fVar170 = auVar71._12_4_;
    auVar211._12_4_ = auVar225._12_4_ * fVar170;
    auVar211._16_4_ = auVar225._16_4_ * 0.0;
    auVar211._20_4_ = auVar225._20_4_ * 0.0;
    auVar211._24_4_ = auVar225._24_4_ * 0.0;
    auVar211._28_4_ = local_860._0_4_;
    auVar113._4_4_ = auVar230._4_4_ * fVar166;
    auVar113._0_4_ = auVar230._0_4_ * fVar150;
    auVar113._8_4_ = auVar230._8_4_ * fVar168;
    auVar113._12_4_ = auVar230._12_4_ * fVar170;
    auVar113._16_4_ = auVar230._16_4_ * 0.0;
    auVar113._20_4_ = auVar230._20_4_ * 0.0;
    auVar113._24_4_ = auVar230._24_4_ * 0.0;
    auVar113._28_4_ = fVar199;
    auVar213._0_4_ = auVar235._0_4_ * fVar150;
    auVar213._4_4_ = auVar235._4_4_ * fVar166;
    auVar213._8_4_ = auVar235._8_4_ * fVar168;
    auVar213._12_4_ = auVar235._12_4_ * fVar170;
    auVar213._16_4_ = auVar235._16_4_ * 0.0;
    auVar213._20_4_ = auVar235._20_4_ * 0.0;
    auVar213._28_36_ = auVar212._28_36_;
    auVar213._24_4_ = auVar235._24_4_ * 0.0;
    auVar82 = vmulps_avx512vl(auVar85,ZEXT1632(auVar71));
    auVar80 = vfmadd231ps_avx512vl(auVar211,auVar93,auVar244._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar113,auVar93,auVar245._0_32_);
    auVar72 = vfmadd231ps_fma(auVar213._0_32_,auVar93,auVar239._0_32_);
    auVar73 = vfmadd231ps_fma(auVar82,auVar93,auVar228._0_32_);
    auVar82 = vmulps_avx512vl(auVar83,ZEXT1632(auVar71));
    auVar98 = ZEXT1632(auVar71);
    auVar94 = vmulps_avx512vl(auVar86,auVar98);
    auVar95 = vmulps_avx512vl(auVar87,auVar98);
    auVar96 = vmulps_avx512vl(auVar88,auVar98);
    auVar74 = vfmadd231ps_fma(auVar82,auVar93,auVar225._0_32_);
    auVar69 = vfmadd231ps_fma(auVar94,auVar93,auVar230._0_32_);
    auVar75 = vfmadd231ps_fma(auVar95,auVar93,auVar235._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar85);
    auVar94 = vmulps_avx512vl(auVar84,auVar98);
    auVar95 = vmulps_avx512vl(auVar89,auVar98);
    auVar96 = vmulps_avx512vl(auVar90,auVar98);
    auVar97 = vmulps_avx512vl(auVar91,auVar98);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar83);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar86);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar87);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar88);
    auVar225._28_36_ = auVar243._28_36_;
    auVar225._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar74._12_4_,
                            CONCAT48(fVar168 * auVar74._8_4_,
                                     CONCAT44(fVar166 * auVar74._4_4_,fVar150 * auVar74._0_4_))));
    auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar69));
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar71),ZEXT1632(auVar75));
    auVar100 = vmulps_avx512vl(ZEXT1632(auVar71),auVar82);
    auVar71 = vfmadd231ps_fma(auVar225._0_32_,auVar93,auVar80);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar81);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar72));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar93,ZEXT1632(auVar73));
    auVar224._0_4_ = auVar94._0_4_ * fVar150;
    auVar224._4_4_ = auVar94._4_4_ * fVar166;
    auVar224._8_4_ = auVar94._8_4_ * fVar168;
    auVar224._12_4_ = auVar94._12_4_ * fVar170;
    auVar224._16_4_ = auVar94._16_4_ * 0.0;
    auVar224._20_4_ = auVar94._20_4_ * 0.0;
    auVar224._24_4_ = auVar94._24_4_ * 0.0;
    auVar224._28_4_ = 0;
    auVar114._4_4_ = auVar95._4_4_ * fVar166;
    auVar114._0_4_ = auVar95._0_4_ * fVar150;
    auVar114._8_4_ = auVar95._8_4_ * fVar168;
    auVar114._12_4_ = auVar95._12_4_ * fVar170;
    auVar114._16_4_ = auVar95._16_4_ * 0.0;
    auVar114._20_4_ = auVar95._20_4_ * 0.0;
    auVar114._24_4_ = auVar95._24_4_ * 0.0;
    auVar114._28_4_ = auVar94._28_4_;
    auVar117._4_4_ = auVar96._4_4_ * fVar166;
    auVar117._0_4_ = auVar96._0_4_ * fVar150;
    auVar117._8_4_ = auVar96._8_4_ * fVar168;
    auVar117._12_4_ = auVar96._12_4_ * fVar170;
    auVar117._16_4_ = auVar96._16_4_ * 0.0;
    auVar117._20_4_ = auVar96._20_4_ * 0.0;
    auVar117._24_4_ = auVar96._24_4_ * 0.0;
    auVar117._28_4_ = auVar95._28_4_;
    auVar118._4_4_ = auVar97._4_4_ * fVar166;
    auVar118._0_4_ = auVar97._0_4_ * fVar150;
    auVar118._8_4_ = auVar97._8_4_ * fVar168;
    auVar118._12_4_ = auVar97._12_4_ * fVar170;
    auVar118._16_4_ = auVar97._16_4_ * 0.0;
    auVar118._20_4_ = auVar97._20_4_ * 0.0;
    auVar118._24_4_ = auVar97._24_4_ * 0.0;
    auVar118._28_4_ = auVar96._28_4_;
    auVar72 = vfmadd231ps_fma(auVar224,auVar93,ZEXT1632(auVar74));
    auVar73 = vfmadd231ps_fma(auVar114,auVar93,ZEXT1632(auVar69));
    auVar74 = vfmadd231ps_fma(auVar117,auVar93,ZEXT1632(auVar75));
    auVar69 = vfmadd231ps_fma(auVar118,auVar93,auVar82);
    auVar35._28_4_ = auVar81._28_4_;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(auVar73._12_4_ * fVar170,
                            CONCAT48(auVar73._8_4_ * fVar168,
                                     CONCAT44(auVar73._4_4_ * fVar166,auVar73._0_4_ * fVar150))));
    auVar36._28_4_ = auVar80._28_4_;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(auVar74._12_4_ * fVar170,
                            CONCAT48(auVar74._8_4_ * fVar168,
                                     CONCAT44(auVar74._4_4_ * fVar166,auVar74._0_4_ * fVar150))));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar72._12_4_,
                                                 CONCAT48(fVar168 * auVar72._8_4_,
                                                          CONCAT44(fVar166 * auVar72._4_4_,
                                                                   fVar150 * auVar72._0_4_)))),
                              auVar93,ZEXT1632(auVar71));
    auVar95 = vfmadd231ps_avx512vl(auVar35,auVar93,auVar98);
    auVar96 = vfmadd231ps_avx512vl(auVar36,auVar93,auVar99);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar69._12_4_ * fVar170,
                                            CONCAT48(auVar69._8_4_ * fVar168,
                                                     CONCAT44(auVar69._4_4_ * fVar166,
                                                              auVar69._0_4_ * fVar150)))),auVar100,
                         auVar93);
    auVar93 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar71));
    auVar80 = vsubps_avx512vl(ZEXT1632(auVar73),auVar98);
    auVar81 = vsubps_avx512vl(ZEXT1632(auVar74),auVar99);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar69),auVar100);
    auVar236._0_4_ = fVar136 * auVar93._0_4_ * 3.0;
    auVar236._4_4_ = fVar136 * auVar93._4_4_ * 3.0;
    auVar236._8_4_ = fVar136 * auVar93._8_4_ * 3.0;
    auVar236._12_4_ = fVar136 * auVar93._12_4_ * 3.0;
    auVar236._16_4_ = fVar136 * auVar93._16_4_ * 3.0;
    auVar236._20_4_ = fVar136 * auVar93._20_4_ * 3.0;
    auVar236._24_4_ = fVar136 * auVar93._24_4_ * 3.0;
    auVar236._28_4_ = 0;
    auVar238._0_4_ = fVar136 * auVar80._0_4_ * 3.0;
    auVar238._4_4_ = fVar136 * auVar80._4_4_ * 3.0;
    auVar238._8_4_ = fVar136 * auVar80._8_4_ * 3.0;
    auVar238._12_4_ = fVar136 * auVar80._12_4_ * 3.0;
    auVar238._16_4_ = fVar136 * auVar80._16_4_ * 3.0;
    auVar238._20_4_ = fVar136 * auVar80._20_4_ * 3.0;
    auVar238._24_4_ = fVar136 * auVar80._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    auVar37._4_4_ = fVar136 * auVar81._4_4_ * 3.0;
    auVar37._0_4_ = fVar136 * auVar81._0_4_ * 3.0;
    auVar37._8_4_ = fVar136 * auVar81._8_4_ * 3.0;
    auVar37._12_4_ = fVar136 * auVar81._12_4_ * 3.0;
    auVar37._16_4_ = fVar136 * auVar81._16_4_ * 3.0;
    auVar37._20_4_ = fVar136 * auVar81._20_4_ * 3.0;
    auVar37._24_4_ = fVar136 * auVar81._24_4_ * 3.0;
    auVar37._28_4_ = auVar97._28_4_;
    fVar150 = auVar94._0_4_ * 3.0 * fVar136;
    fVar166 = auVar94._4_4_ * 3.0 * fVar136;
    auVar38._4_4_ = fVar166;
    auVar38._0_4_ = fVar150;
    fVar168 = auVar94._8_4_ * 3.0 * fVar136;
    auVar38._8_4_ = fVar168;
    fVar170 = auVar94._12_4_ * 3.0 * fVar136;
    auVar38._12_4_ = fVar170;
    fVar199 = auVar94._16_4_ * 3.0 * fVar136;
    auVar38._16_4_ = fVar199;
    fVar173 = auVar94._20_4_ * 3.0 * fVar136;
    auVar38._20_4_ = fVar173;
    fVar175 = auVar94._24_4_ * 3.0 * fVar136;
    auVar38._24_4_ = fVar175;
    auVar38._28_4_ = fVar136;
    auVar71 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar98 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar80 = ZEXT1632(auVar71);
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,auVar80);
    auVar216._0_4_ = auVar82._0_4_ + fVar150;
    auVar216._4_4_ = auVar82._4_4_ + fVar166;
    auVar216._8_4_ = auVar82._8_4_ + fVar168;
    auVar216._12_4_ = auVar82._12_4_ + fVar170;
    auVar216._16_4_ = auVar82._16_4_ + fVar199;
    auVar216._20_4_ = auVar82._20_4_ + fVar173;
    auVar216._24_4_ = auVar82._24_4_ + fVar175;
    auVar216._28_4_ = auVar82._28_4_ + fVar136;
    auVar93 = vmaxps_avx(auVar82,auVar216);
    auVar100 = vminps_avx512vl(auVar82,auVar216);
    auVar101 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,auVar80);
    auVar102 = vpermt2ps_avx512vl(auVar236,_DAT_01fb9fc0,auVar80);
    auVar103 = vpermt2ps_avx512vl(auVar238,_DAT_01fb9fc0,auVar80);
    auVar113 = ZEXT1632(auVar71);
    auVar104 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar113);
    auVar82 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar113);
    auVar82 = vsubps_avx(auVar101,auVar82);
    auVar80 = vsubps_avx(auVar97,ZEXT1632(auVar75));
    auVar81 = vsubps_avx(auVar98,auVar95);
    auVar94 = vsubps_avx(auVar99,auVar96);
    auVar105 = vmulps_avx512vl(auVar81,auVar37);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar238,auVar94);
    auVar106 = vmulps_avx512vl(auVar94,auVar236);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar37,auVar80);
    auVar107 = vmulps_avx512vl(auVar80,auVar238);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar236,auVar81);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar94,auVar94);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar81,auVar81);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar80,auVar80);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar246);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar107);
    auVar108 = vmulps_avx512vl(auVar81,auVar104);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar103,auVar94);
    auVar109 = vmulps_avx512vl(auVar94,auVar102);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar104,auVar80);
    auVar110 = vmulps_avx512vl(auVar80,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar102,auVar81);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar105 = vmaxps_avx512vl(auVar105,auVar107);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar107 = vmaxps_avx512vl(auVar82,auVar101);
    auVar93 = vmaxps_avx512vl(auVar93,auVar107);
    auVar107 = vaddps_avx512vl(auVar105,auVar93);
    auVar93 = vminps_avx(auVar82,auVar101);
    auVar93 = vminps_avx512vl(auVar100,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar105);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar82 = vmulps_avx512vl(auVar107,auVar108);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    local_840 = vmulps_avx512vl(auVar93,auVar109);
    auVar93 = vmulps_avx512vl(auVar82,auVar82);
    auVar82 = vrsqrt14ps_avx512vl(auVar106);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar100 = vmulps_avx512vl(auVar106,auVar110);
    fVar150 = auVar82._0_4_;
    fVar166 = auVar82._4_4_;
    fVar168 = auVar82._8_4_;
    fVar170 = auVar82._12_4_;
    fVar136 = auVar82._16_4_;
    fVar199 = auVar82._20_4_;
    fVar173 = auVar82._24_4_;
    auVar39._4_4_ = fVar166 * fVar166 * fVar166 * auVar100._4_4_;
    auVar39._0_4_ = fVar150 * fVar150 * fVar150 * auVar100._0_4_;
    auVar39._8_4_ = fVar168 * fVar168 * fVar168 * auVar100._8_4_;
    auVar39._12_4_ = fVar170 * fVar170 * fVar170 * auVar100._12_4_;
    auVar39._16_4_ = fVar136 * fVar136 * fVar136 * auVar100._16_4_;
    auVar39._20_4_ = fVar199 * fVar199 * fVar199 * auVar100._20_4_;
    auVar39._24_4_ = fVar173 * fVar173 * fVar173 * auVar100._24_4_;
    auVar39._28_4_ = auVar107._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar82 = vfmadd231ps_avx512vl(auVar39,auVar82,auVar111);
    auVar243 = ZEXT3264(auVar82);
    auVar100 = vmulps_avx512vl(auVar80,auVar82);
    auVar101 = vmulps_avx512vl(auVar81,auVar82);
    auVar105 = vmulps_avx512vl(auVar94,auVar82);
    auVar211 = ZEXT1632(auVar75);
    auVar106 = vsubps_avx512vl(auVar113,auVar211);
    auVar107 = vsubps_avx512vl(auVar113,auVar95);
    auVar108 = vsubps_avx512vl(auVar113,auVar96);
    auVar109 = vmulps_avx512vl(_local_3c0,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_3a0,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,local_380,auVar106);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar106);
    auVar111 = vmulps_avx512vl(_local_3c0,auVar105);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,local_3a0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar100,local_380);
    auVar105 = vmulps_avx512vl(auVar108,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar100);
    auVar101 = vmulps_avx512vl(auVar111,auVar111);
    auVar105 = vsubps_avx512vl(auVar92,auVar101);
    auVar112 = vmulps_avx512vl(auVar111,auVar100);
    auVar109 = vsubps_avx512vl(auVar109,auVar112);
    auVar109 = vaddps_avx512vl(auVar109,auVar109);
    auVar112 = vmulps_avx512vl(auVar100,auVar100);
    local_880 = vsubps_avx512vl(auVar110,auVar112);
    auVar93 = vsubps_avx512vl(local_880,auVar93);
    local_6e0 = vmulps_avx512vl(auVar109,auVar109);
    auVar112._8_4_ = 0x40800000;
    auVar112._0_8_ = 0x4080000040800000;
    auVar112._12_4_ = 0x40800000;
    auVar112._16_4_ = 0x40800000;
    auVar112._20_4_ = 0x40800000;
    auVar112._24_4_ = 0x40800000;
    auVar112._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar105,auVar112);
    auVar110 = vmulps_avx512vl(_local_4c0,auVar93);
    auVar110 = vsubps_avx512vl(local_6e0,auVar110);
    uVar67 = vcmpps_avx512vl(auVar110,auVar113,5);
    bVar57 = (byte)uVar67;
    fVar150 = (float)local_680._0_4_;
    fVar166 = (float)local_680._4_4_;
    fVar168 = fStack_678;
    fVar170 = fStack_674;
    fVar136 = fStack_670;
    fVar199 = fStack_66c;
    fVar173 = fStack_668;
    fVar175 = fStack_664;
    if (bVar57 == 0) {
LAB_0199f00b:
      auVar212 = ZEXT3264(_DAT_01f7b040);
      auVar244 = ZEXT3264(local_740);
      auVar245 = ZEXT3264(local_760);
      auVar239 = ZEXT3264(local_780);
      auVar228 = ZEXT3264(local_700);
      auVar225 = ZEXT3264(local_720);
      auVar230 = ZEXT3264(local_7a0);
      auVar235 = ZEXT3264(local_7c0);
    }
    else {
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar112 = vaddps_avx512vl(auVar105,auVar105);
      local_540 = vrcp14ps_avx512vl(auVar112);
      auVar113 = vfnmadd213ps_avx512vl(local_540,auVar112,auVar246);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_540,local_540);
      auVar246._8_4_ = 0x80000000;
      auVar246._0_8_ = 0x8000000080000000;
      auVar246._12_4_ = 0x80000000;
      auVar246._16_4_ = 0x80000000;
      auVar246._20_4_ = 0x80000000;
      auVar246._24_4_ = 0x80000000;
      auVar246._28_4_ = 0x80000000;
      local_660 = vxorps_avx512vl(auVar109,auVar246);
      auVar114 = vsubps_avx512vl(local_660,auVar110);
      local_640 = vmulps_avx512vl(auVar114,auVar113);
      auVar110 = vsubps_avx512vl(auVar110,auVar109);
      local_4e0 = vmulps_avx512vl(auVar110,auVar113);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar110,local_640);
      auVar115._0_4_ =
           (uint)(bVar57 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar110._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar64 * auVar113._4_4_ | (uint)!bVar64 * auVar110._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar64 * auVar113._8_4_ | (uint)!bVar64 * auVar110._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar64 * auVar113._12_4_ | (uint)!bVar64 * auVar110._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar64 * auVar113._16_4_ | (uint)!bVar64 * auVar110._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar64 * auVar113._20_4_ | (uint)!bVar64 * auVar110._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar64 * auVar113._24_4_ | (uint)!bVar64 * auVar110._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar115._28_4_ = (uint)bVar64 * auVar113._28_4_ | (uint)!bVar64 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar110,local_4e0);
      auVar116._0_4_ =
           (uint)(bVar57 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar110._0_4_;
      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar64 * auVar113._4_4_ | (uint)!bVar64 * auVar110._4_4_;
      bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar64 * auVar113._8_4_ | (uint)!bVar64 * auVar110._8_4_;
      bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar64 * auVar113._12_4_ | (uint)!bVar64 * auVar110._12_4_;
      bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar64 * auVar113._16_4_ | (uint)!bVar64 * auVar110._16_4_;
      bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar64 * auVar113._20_4_ | (uint)!bVar64 * auVar110._20_4_;
      bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar64 * auVar113._24_4_ | (uint)!bVar64 * auVar110._24_4_;
      bVar64 = SUB81(uVar67 >> 7,0);
      auVar116._28_4_ = (uint)bVar64 * auVar113._28_4_ | (uint)!bVar64 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar101,auVar110);
      local_500 = vmaxps_avx512vl(local_220,auVar110);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      local_520 = vmulps_avx512vl(local_500,auVar29);
      vandps_avx512vl(auVar105,auVar110);
      uVar60 = vcmpps_avx512vl(local_520,local_520,1);
      uVar67 = uVar67 & uVar60;
      bVar62 = (byte)uVar67;
      if (bVar62 != 0) {
        uVar60 = vcmpps_avx512vl(auVar93,_DAT_01f7b000,2);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar105 = vblendmps_avx512vl(auVar93,auVar101);
        bVar61 = (byte)uVar60;
        uVar68 = (uint)(bVar61 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar61 & 1) * local_520._0_4_;
        bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar128 = (uint)bVar64 * auVar105._4_4_ | (uint)!bVar64 * local_520._4_4_;
        bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar129 = (uint)bVar64 * auVar105._8_4_ | (uint)!bVar64 * local_520._8_4_;
        bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar130 = (uint)bVar64 * auVar105._12_4_ | (uint)!bVar64 * local_520._12_4_;
        bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar131 = (uint)bVar64 * auVar105._16_4_ | (uint)!bVar64 * local_520._16_4_;
        bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar132 = (uint)bVar64 * auVar105._20_4_ | (uint)!bVar64 * local_520._20_4_;
        bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar133 = (uint)bVar64 * auVar105._24_4_ | (uint)!bVar64 * local_520._24_4_;
        bVar64 = SUB81(uVar60 >> 7,0);
        uVar134 = (uint)bVar64 * auVar105._28_4_ | (uint)!bVar64 * local_520._28_4_;
        auVar115._0_4_ = (bVar62 & 1) * uVar68 | !(bool)(bVar62 & 1) * auVar115._0_4_;
        bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar115._4_4_ = bVar64 * uVar128 | !bVar64 * auVar115._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar115._8_4_ = bVar64 * uVar129 | !bVar64 * auVar115._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar115._12_4_ = bVar64 * uVar130 | !bVar64 * auVar115._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar115._16_4_ = bVar64 * uVar131 | !bVar64 * auVar115._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar115._20_4_ = bVar64 * uVar132 | !bVar64 * auVar115._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar115._24_4_ = bVar64 * uVar133 | !bVar64 * auVar115._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar115._28_4_ = bVar64 * uVar134 | !bVar64 * auVar115._28_4_;
        auVar93 = vblendmps_avx512vl(auVar101,auVar93);
        bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar14 = SUB81(uVar60 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar61 & 1) * auVar93._0_4_ | !(bool)(bVar61 & 1) * uVar68) |
             !(bool)(bVar62 & 1) * auVar116._0_4_;
        bVar8 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar8 * ((uint)bVar64 * auVar93._4_4_ | !bVar64 * uVar128) |
             !bVar8 * auVar116._4_4_;
        bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar64 * ((uint)bVar9 * auVar93._8_4_ | !bVar9 * uVar129) |
             !bVar64 * auVar116._8_4_;
        bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar64 * ((uint)bVar10 * auVar93._12_4_ | !bVar10 * uVar130) |
             !bVar64 * auVar116._12_4_;
        bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar64 * ((uint)bVar11 * auVar93._16_4_ | !bVar11 * uVar131) |
             !bVar64 * auVar116._16_4_;
        bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar64 * ((uint)bVar12 * auVar93._20_4_ | !bVar12 * uVar132) |
             !bVar64 * auVar116._20_4_;
        bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar64 * ((uint)bVar13 * auVar93._24_4_ | !bVar13 * uVar133) |
             !bVar64 * auVar116._24_4_;
        bVar64 = SUB81(uVar67 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar64 * ((uint)bVar14 * auVar93._28_4_ | !bVar14 * uVar134) |
             !bVar64 * auVar116._28_4_;
        bVar57 = (~bVar62 | bVar61) & bVar57;
      }
      if ((bVar57 & 0x7f) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar247 = ZEXT3264(auVar93);
        auVar212 = ZEXT3264(_DAT_01f7b040);
        auVar244 = ZEXT3264(local_740);
        auVar245 = ZEXT3264(local_760);
        auVar239 = ZEXT3264(local_780);
        auVar228 = ZEXT3264(local_700);
        auVar225 = ZEXT3264(local_720);
        auVar230 = ZEXT3264(local_7a0);
        auVar235 = ZEXT3264(local_7c0);
      }
      else {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar101 = vxorps_avx512vl(auVar104,auVar93);
        auVar102 = vxorps_avx512vl(auVar102,auVar93);
        uVar68 = *(uint *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
        auVar212 = ZEXT464(uVar68);
        auVar103 = vxorps_avx512vl(auVar103,auVar93);
        auVar71 = vsubss_avx512f(ZEXT416(uVar68),ZEXT416((uint)local_610._0_4_));
        auVar104 = vbroadcastss_avx512vl(auVar71);
        auVar104 = vminps_avx512vl(auVar104,auVar116);
        auVar56._4_4_ = fStack_23c;
        auVar56._0_4_ = local_240;
        auVar56._8_4_ = fStack_238;
        auVar56._12_4_ = fStack_234;
        auVar56._16_4_ = fStack_230;
        auVar56._20_4_ = fStack_22c;
        auVar56._24_4_ = fStack_228;
        auVar56._28_4_ = fStack_224;
        auVar105 = vmaxps_avx512vl(auVar56,auVar115);
        auVar108 = vmulps_avx512vl(auVar108,auVar37);
        auVar107 = vfmadd213ps_avx512vl(auVar107,auVar238,auVar108);
        auVar71 = vfmadd213ps_fma(auVar106,auVar236,auVar107);
        auVar106 = vmulps_avx512vl(_local_3c0,auVar37);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_3a0,auVar238);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_380,auVar236);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar106,auVar107);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar15 = vcmpps_avx512vl(auVar107,auVar108,1);
        auVar110 = vxorps_avx512vl(ZEXT1632(auVar71),auVar93);
        auVar113 = vrcp14ps_avx512vl(auVar106);
        auVar114 = vxorps_avx512vl(auVar106,auVar93);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar118 = vfnmadd213ps_avx512vl(auVar113,auVar106,auVar117);
        auVar71 = vfmadd132ps_fma(auVar118,auVar113,auVar113);
        fVar151 = auVar71._0_4_ * auVar110._0_4_;
        fVar167 = auVar71._4_4_ * auVar110._4_4_;
        auVar40._4_4_ = fVar167;
        auVar40._0_4_ = fVar151;
        fVar169 = auVar71._8_4_ * auVar110._8_4_;
        auVar40._8_4_ = fVar169;
        fVar171 = auVar71._12_4_ * auVar110._12_4_;
        auVar40._12_4_ = fVar171;
        fVar172 = auVar110._16_4_ * 0.0;
        auVar40._16_4_ = fVar172;
        fVar174 = auVar110._20_4_ * 0.0;
        auVar40._20_4_ = fVar174;
        fVar176 = auVar110._24_4_ * 0.0;
        auVar40._24_4_ = fVar176;
        auVar40._28_4_ = auVar110._28_4_;
        uVar17 = vcmpps_avx512vl(auVar106,auVar114,1);
        bVar62 = (byte)uVar15 | (byte)uVar17;
        auVar241._8_4_ = 0xff800000;
        auVar241._0_8_ = 0xff800000ff800000;
        auVar241._12_4_ = 0xff800000;
        auVar241._16_4_ = 0xff800000;
        auVar241._20_4_ = 0xff800000;
        auVar241._24_4_ = 0xff800000;
        auVar241._28_4_ = 0xff800000;
        auVar118 = vblendmps_avx512vl(auVar40,auVar241);
        auVar119._0_4_ =
             (uint)(bVar62 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar113._0_4_;
        bVar64 = (bool)(bVar62 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar64 * auVar118._4_4_ | (uint)!bVar64 * auVar113._4_4_;
        bVar64 = (bool)(bVar62 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar64 * auVar118._8_4_ | (uint)!bVar64 * auVar113._8_4_;
        bVar64 = (bool)(bVar62 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar64 * auVar118._12_4_ | (uint)!bVar64 * auVar113._12_4_;
        bVar64 = (bool)(bVar62 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar64 * auVar118._16_4_ | (uint)!bVar64 * auVar113._16_4_;
        bVar64 = (bool)(bVar62 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar64 * auVar118._20_4_ | (uint)!bVar64 * auVar113._20_4_;
        bVar64 = (bool)(bVar62 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar64 * auVar118._24_4_ | (uint)!bVar64 * auVar113._24_4_;
        auVar119._28_4_ =
             (uint)(bVar62 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar113._28_4_;
        auVar105 = vmaxps_avx512vl(auVar105,auVar119);
        uVar17 = vcmpps_avx512vl(auVar106,auVar114,6);
        bVar62 = (byte)uVar15 | (byte)uVar17;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar120._0_4_ =
             (uint)(bVar62 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)fVar151;
        bVar64 = (bool)(bVar62 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar64 * auVar106._4_4_ | (uint)!bVar64 * (int)fVar167;
        bVar64 = (bool)(bVar62 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar64 * auVar106._8_4_ | (uint)!bVar64 * (int)fVar169;
        bVar64 = (bool)(bVar62 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar64 * auVar106._12_4_ | (uint)!bVar64 * (int)fVar171;
        bVar64 = (bool)(bVar62 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar64 * auVar106._16_4_ | (uint)!bVar64 * (int)fVar172;
        bVar64 = (bool)(bVar62 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar64 * auVar106._20_4_ | (uint)!bVar64 * (int)fVar174;
        bVar64 = (bool)(bVar62 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar64 * auVar106._24_4_ | (uint)!bVar64 * (int)fVar176;
        auVar120._28_4_ =
             (uint)(bVar62 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar110._28_4_;
        auVar110 = vminps_avx512vl(auVar104,auVar120);
        auVar71 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar71),auVar97);
        auVar98 = vsubps_avx512vl(ZEXT1632(auVar71),auVar98);
        auVar104 = ZEXT1632(auVar71);
        auVar99 = vsubps_avx512vl(auVar104,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar101);
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar97);
        auVar98 = vmulps_avx512vl(_local_3c0,auVar101);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_3a0,auVar103);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_380,auVar102);
        vandps_avx512vl(auVar98,auVar107);
        uVar15 = vcmpps_avx512vl(auVar98,auVar108,1);
        auVar97 = vxorps_avx512vl(auVar97,auVar93);
        auVar99 = vrcp14ps_avx512vl(auVar98);
        auVar93 = vxorps_avx512vl(auVar98,auVar93);
        auVar101 = vfnmadd213ps_avx512vl(auVar99,auVar98,auVar117);
        auVar71 = vfmadd132ps_fma(auVar101,auVar99,auVar99);
        fVar151 = auVar71._0_4_ * auVar97._0_4_;
        fVar167 = auVar71._4_4_ * auVar97._4_4_;
        auVar41._4_4_ = fVar167;
        auVar41._0_4_ = fVar151;
        fVar169 = auVar71._8_4_ * auVar97._8_4_;
        auVar41._8_4_ = fVar169;
        fVar171 = auVar71._12_4_ * auVar97._12_4_;
        auVar41._12_4_ = fVar171;
        fVar172 = auVar97._16_4_ * 0.0;
        auVar41._16_4_ = fVar172;
        fVar174 = auVar97._20_4_ * 0.0;
        auVar41._20_4_ = fVar174;
        fVar176 = auVar97._24_4_ * 0.0;
        auVar41._24_4_ = fVar176;
        auVar41._28_4_ = auVar97._28_4_;
        uVar17 = vcmpps_avx512vl(auVar98,auVar93,1);
        bVar62 = (byte)uVar15 | (byte)uVar17;
        auVar101 = vblendmps_avx512vl(auVar41,auVar241);
        auVar121._0_4_ =
             (uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar99._0_4_;
        bVar64 = (bool)(bVar62 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar64 * auVar101._4_4_ | (uint)!bVar64 * auVar99._4_4_;
        bVar64 = (bool)(bVar62 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar64 * auVar101._8_4_ | (uint)!bVar64 * auVar99._8_4_;
        bVar64 = (bool)(bVar62 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar64 * auVar101._12_4_ | (uint)!bVar64 * auVar99._12_4_;
        bVar64 = (bool)(bVar62 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar64 * auVar101._16_4_ | (uint)!bVar64 * auVar99._16_4_;
        bVar64 = (bool)(bVar62 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar64 * auVar101._20_4_ | (uint)!bVar64 * auVar99._20_4_;
        bVar64 = (bool)(bVar62 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar64 * auVar101._24_4_ | (uint)!bVar64 * auVar99._24_4_;
        auVar121._28_4_ =
             (uint)(bVar62 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar99._28_4_;
        local_360 = vmaxps_avx(auVar105,auVar121);
        uVar17 = vcmpps_avx512vl(auVar98,auVar93,6);
        bVar62 = (byte)uVar15 | (byte)uVar17;
        auVar122._0_4_ =
             (uint)(bVar62 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)fVar151;
        bVar64 = (bool)(bVar62 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar64 * auVar106._4_4_ | (uint)!bVar64 * (int)fVar167;
        bVar64 = (bool)(bVar62 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar64 * auVar106._8_4_ | (uint)!bVar64 * (int)fVar169;
        bVar64 = (bool)(bVar62 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar64 * auVar106._12_4_ | (uint)!bVar64 * (int)fVar171;
        bVar64 = (bool)(bVar62 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar64 * auVar106._16_4_ | (uint)!bVar64 * (int)fVar172;
        bVar64 = (bool)(bVar62 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar64 * auVar106._20_4_ | (uint)!bVar64 * (int)fVar174;
        bVar64 = (bool)(bVar62 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar64 * auVar106._24_4_ | (uint)!bVar64 * (int)fVar176;
        auVar122._28_4_ =
             (uint)(bVar62 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar97._28_4_;
        local_2a0 = vminps_avx(auVar110,auVar122);
        uVar15 = vcmpps_avx512vl(local_360,local_2a0,2);
        bVar57 = bVar57 & 0x7f & (byte)uVar15;
        if (bVar57 == 0) {
          auVar247 = ZEXT3264(auVar117);
          goto LAB_0199f00b;
        }
        auVar97 = vmaxps_avx512vl(auVar104,local_840);
        auVar93 = vfmadd213ps_avx512vl(local_640,auVar111,auVar100);
        fVar151 = auVar82._0_4_;
        fVar167 = auVar82._4_4_;
        auVar42._4_4_ = fVar167 * auVar93._4_4_;
        auVar42._0_4_ = fVar151 * auVar93._0_4_;
        fVar169 = auVar82._8_4_;
        auVar42._8_4_ = fVar169 * auVar93._8_4_;
        fVar171 = auVar82._12_4_;
        auVar42._12_4_ = fVar171 * auVar93._12_4_;
        fVar172 = auVar82._16_4_;
        auVar42._16_4_ = fVar172 * auVar93._16_4_;
        fVar174 = auVar82._20_4_;
        auVar42._20_4_ = fVar174 * auVar93._20_4_;
        fVar176 = auVar82._24_4_;
        auVar42._24_4_ = fVar176 * auVar93._24_4_;
        auVar42._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd213ps_avx512vl(local_4e0,auVar111,auVar100);
        auVar43._4_4_ = fVar167 * auVar93._4_4_;
        auVar43._0_4_ = fVar151 * auVar93._0_4_;
        auVar43._8_4_ = fVar169 * auVar93._8_4_;
        auVar43._12_4_ = fVar171 * auVar93._12_4_;
        auVar43._16_4_ = fVar172 * auVar93._16_4_;
        auVar43._20_4_ = fVar174 * auVar93._20_4_;
        auVar43._24_4_ = fVar176 * auVar93._24_4_;
        auVar43._28_4_ = auVar93._28_4_;
        auVar93 = vminps_avx512vl(auVar42,auVar117);
        auVar50 = ZEXT812(0);
        auVar98 = ZEXT1232(auVar50) << 0x20;
        auVar93 = vmaxps_avx(auVar93,ZEXT1232(auVar50) << 0x20);
        auVar99 = vminps_avx512vl(auVar43,auVar117);
        auVar44._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar93._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar44,_local_6c0,_local_860);
        auVar93 = vmaxps_avx(auVar99,ZEXT1232(auVar50) << 0x20);
        auVar45._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar93._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar45,_local_6c0,_local_860);
        auVar46._4_4_ = auVar97._4_4_ * auVar97._4_4_;
        auVar46._0_4_ = auVar97._0_4_ * auVar97._0_4_;
        auVar46._8_4_ = auVar97._8_4_ * auVar97._8_4_;
        auVar46._12_4_ = auVar97._12_4_ * auVar97._12_4_;
        auVar46._16_4_ = auVar97._16_4_ * auVar97._16_4_;
        auVar46._20_4_ = auVar97._20_4_ * auVar97._20_4_;
        auVar46._24_4_ = auVar97._24_4_ * auVar97._24_4_;
        auVar46._28_4_ = auVar97._28_4_;
        auVar93 = vsubps_avx(local_880,auVar46);
        auVar47._4_4_ = auVar93._4_4_ * (float)local_4c0._4_4_;
        auVar47._0_4_ = auVar93._0_4_ * (float)local_4c0._0_4_;
        auVar47._8_4_ = auVar93._8_4_ * fStack_4b8;
        auVar47._12_4_ = auVar93._12_4_ * fStack_4b4;
        auVar47._16_4_ = auVar93._16_4_ * fStack_4b0;
        auVar47._20_4_ = auVar93._20_4_ * fStack_4ac;
        auVar47._24_4_ = auVar93._24_4_ * fStack_4a8;
        auVar47._28_4_ = auVar97._28_4_;
        auVar97 = vsubps_avx(local_6e0,auVar47);
        uVar15 = vcmpps_avx512vl(auVar97,ZEXT1232(auVar50) << 0x20,5);
        bVar62 = (byte)uVar15;
        if (bVar62 == 0) {
          bVar62 = 0;
          auVar82 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar225 = ZEXT864(0) << 0x20;
          auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar234 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar123._8_4_ = 0x7f800000;
          auVar123._0_8_ = 0x7f8000007f800000;
          auVar123._12_4_ = 0x7f800000;
          auVar123._16_4_ = 0x7f800000;
          auVar123._20_4_ = 0x7f800000;
          auVar123._24_4_ = 0x7f800000;
          auVar123._28_4_ = 0x7f800000;
          auVar124._8_4_ = 0xff800000;
          auVar124._0_8_ = 0xff800000ff800000;
          auVar124._12_4_ = 0xff800000;
          auVar124._16_4_ = 0xff800000;
          auVar124._20_4_ = 0xff800000;
          auVar124._24_4_ = 0xff800000;
          auVar124._28_4_ = 0xff800000;
        }
        else {
          auVar72 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
          uVar67 = vcmpps_avx512vl(auVar97,auVar104,5);
          auVar97 = vsqrtps_avx(auVar97);
          auVar98 = vfnmadd213ps_avx512vl(auVar112,local_540,auVar117);
          auVar101 = vfmadd132ps_avx512vl(auVar98,local_540,local_540);
          auVar98 = vsubps_avx(local_660,auVar97);
          auVar102 = vmulps_avx512vl(auVar98,auVar101);
          auVar97 = vsubps_avx512vl(auVar97,auVar109);
          auVar101 = vmulps_avx512vl(auVar97,auVar101);
          auVar97 = vfmadd213ps_avx512vl(auVar111,auVar102,auVar100);
          auVar48._4_4_ = fVar167 * auVar97._4_4_;
          auVar48._0_4_ = fVar151 * auVar97._0_4_;
          auVar48._8_4_ = fVar169 * auVar97._8_4_;
          auVar48._12_4_ = fVar171 * auVar97._12_4_;
          auVar48._16_4_ = fVar172 * auVar97._16_4_;
          auVar48._20_4_ = fVar174 * auVar97._20_4_;
          auVar48._24_4_ = fVar176 * auVar97._24_4_;
          auVar48._28_4_ = auVar99._28_4_;
          auVar97 = vmulps_avx512vl(local_380,auVar102);
          auVar98 = vmulps_avx512vl(local_3a0,auVar102);
          auVar103 = vmulps_avx512vl(_local_3c0,auVar102);
          auVar99 = vfmadd213ps_avx512vl(auVar80,auVar48,auVar211);
          auVar97 = vsubps_avx512vl(auVar97,auVar99);
          auVar99 = vfmadd213ps_avx512vl(auVar81,auVar48,auVar95);
          auVar99 = vsubps_avx512vl(auVar98,auVar99);
          auVar71 = vfmadd213ps_fma(auVar48,auVar94,auVar96);
          auVar98 = vsubps_avx(auVar103,ZEXT1632(auVar71));
          auVar234 = auVar98._0_28_;
          auVar98 = vfmadd213ps_avx512vl(auVar111,auVar101,auVar100);
          auVar100 = vmulps_avx512vl(auVar82,auVar98);
          auVar243 = ZEXT3264(auVar100);
          auVar82 = vmulps_avx512vl(local_380,auVar101);
          auVar103 = vmulps_avx512vl(local_3a0,auVar101);
          auVar104 = vmulps_avx512vl(_local_3c0,auVar101);
          auVar71 = vfmadd213ps_fma(auVar80,auVar100,auVar211);
          auVar98 = vsubps_avx(auVar82,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar81,auVar100,auVar95);
          auVar82 = vsubps_avx512vl(auVar103,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar94,auVar100,auVar96);
          auVar80 = vsubps_avx512vl(auVar104,ZEXT1632(auVar71));
          auVar225 = ZEXT3264(auVar80);
          auVar195._8_4_ = 0x7f800000;
          auVar195._0_8_ = 0x7f8000007f800000;
          auVar195._12_4_ = 0x7f800000;
          auVar195._16_4_ = 0x7f800000;
          auVar195._20_4_ = 0x7f800000;
          auVar195._24_4_ = 0x7f800000;
          auVar195._28_4_ = 0x7f800000;
          auVar80 = vblendmps_avx512vl(auVar195,auVar102);
          bVar64 = (bool)((byte)uVar67 & 1);
          auVar123._0_4_ = (uint)bVar64 * auVar80._0_4_ | (uint)!bVar64 * auVar75._0_4_;
          bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * auVar75._4_4_;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * auVar75._8_4_;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * auVar75._12_4_;
          iVar1 = (uint)((byte)(uVar67 >> 4) & 1) * auVar80._16_4_;
          auVar123._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar67 >> 5) & 1) * auVar80._20_4_;
          auVar123._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar67 >> 6) & 1) * auVar80._24_4_;
          auVar123._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar67 >> 7) * auVar80._28_4_;
          auVar123._28_4_ = iVar4;
          auVar196._8_4_ = 0xff800000;
          auVar196._0_8_ = 0xff800000ff800000;
          auVar196._12_4_ = 0xff800000;
          auVar196._16_4_ = 0xff800000;
          auVar196._20_4_ = 0xff800000;
          auVar196._24_4_ = 0xff800000;
          auVar196._28_4_ = 0xff800000;
          auVar80 = vblendmps_avx512vl(auVar196,auVar101);
          bVar64 = (bool)((byte)uVar67 & 1);
          auVar124._0_4_ = (uint)bVar64 * auVar80._0_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = SUB81(uVar67 >> 7,0);
          auVar124._28_4_ = (uint)bVar64 * auVar80._28_4_ | (uint)!bVar64 * -0x800000;
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar80 = vmulps_avx512vl(local_500,auVar30);
          uVar60 = vcmpps_avx512vl(auVar80,local_520,0xe);
          uVar67 = uVar67 & uVar60;
          bVar61 = (byte)uVar67;
          if (bVar61 != 0) {
            uVar60 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar72),2);
            auVar229._8_4_ = 0x7f800000;
            auVar229._0_8_ = 0x7f8000007f800000;
            auVar229._12_4_ = 0x7f800000;
            auVar229._16_4_ = 0x7f800000;
            auVar229._20_4_ = 0x7f800000;
            auVar229._24_4_ = 0x7f800000;
            auVar229._28_4_ = 0x7f800000;
            auVar237._8_4_ = 0xff800000;
            auVar237._0_8_ = 0xff800000ff800000;
            auVar237._12_4_ = 0xff800000;
            auVar237._16_4_ = 0xff800000;
            auVar237._20_4_ = 0xff800000;
            auVar237._24_4_ = 0xff800000;
            auVar237._28_4_ = 0xff800000;
            auVar93 = vblendmps_avx512vl(auVar229,auVar237);
            bVar58 = (byte)uVar60;
            uVar68 = (uint)(bVar58 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar80._0_4_;
            bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
            uVar128 = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * auVar80._4_4_;
            bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
            uVar129 = (uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * auVar80._8_4_;
            bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
            uVar130 = (uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * auVar80._12_4_;
            bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
            uVar131 = (uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * auVar80._16_4_;
            bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
            uVar132 = (uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * auVar80._20_4_;
            bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
            uVar133 = (uint)bVar64 * auVar93._24_4_ | (uint)!bVar64 * auVar80._24_4_;
            bVar64 = SUB81(uVar60 >> 7,0);
            uVar134 = (uint)bVar64 * auVar93._28_4_ | (uint)!bVar64 * auVar80._28_4_;
            auVar123._0_4_ = (bVar61 & 1) * uVar68 | !(bool)(bVar61 & 1) * auVar123._0_4_;
            bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar123._4_4_ = bVar64 * uVar128 | !bVar64 * auVar123._4_4_;
            bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar123._8_4_ = bVar64 * uVar129 | !bVar64 * auVar123._8_4_;
            bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar123._12_4_ = bVar64 * uVar130 | !bVar64 * auVar123._12_4_;
            bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar123._16_4_ = bVar64 * uVar131 | (uint)!bVar64 * iVar1;
            bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar123._20_4_ = bVar64 * uVar132 | (uint)!bVar64 * iVar2;
            bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar123._24_4_ = bVar64 * uVar133 | (uint)!bVar64 * iVar3;
            bVar64 = SUB81(uVar67 >> 7,0);
            auVar123._28_4_ = bVar64 * uVar134 | (uint)!bVar64 * iVar4;
            auVar93 = vblendmps_avx512vl(auVar237,auVar229);
            bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar60 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
            bVar14 = SUB81(uVar60 >> 7,0);
            auVar124._0_4_ =
                 (uint)(bVar61 & 1) *
                 ((uint)(bVar58 & 1) * auVar93._0_4_ | !(bool)(bVar58 & 1) * uVar68) |
                 !(bool)(bVar61 & 1) * auVar124._0_4_;
            bVar8 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar124._4_4_ =
                 (uint)bVar8 * ((uint)bVar64 * auVar93._4_4_ | !bVar64 * uVar128) |
                 !bVar8 * auVar124._4_4_;
            bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar124._8_4_ =
                 (uint)bVar64 * ((uint)bVar9 * auVar93._8_4_ | !bVar9 * uVar129) |
                 !bVar64 * auVar124._8_4_;
            bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar124._12_4_ =
                 (uint)bVar64 * ((uint)bVar10 * auVar93._12_4_ | !bVar10 * uVar130) |
                 !bVar64 * auVar124._12_4_;
            bVar64 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar124._16_4_ =
                 (uint)bVar64 * ((uint)bVar11 * auVar93._16_4_ | !bVar11 * uVar131) |
                 !bVar64 * auVar124._16_4_;
            bVar64 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar124._20_4_ =
                 (uint)bVar64 * ((uint)bVar12 * auVar93._20_4_ | !bVar12 * uVar132) |
                 !bVar64 * auVar124._20_4_;
            bVar64 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar124._24_4_ =
                 (uint)bVar64 * ((uint)bVar13 * auVar93._24_4_ | !bVar13 * uVar133) |
                 !bVar64 * auVar124._24_4_;
            bVar64 = SUB81(uVar67 >> 7,0);
            auVar124._28_4_ =
                 (uint)bVar64 * ((uint)bVar14 * auVar93._28_4_ | !bVar14 * uVar134) |
                 !bVar64 * auVar124._28_4_;
            bVar62 = (~bVar61 | bVar58) & bVar62;
          }
        }
        auVar228._0_4_ = (float)local_3c0._0_4_ * auVar225._0_4_;
        auVar228._4_4_ = (float)local_3c0._4_4_ * auVar225._4_4_;
        auVar228._8_4_ = fStack_3b8 * auVar225._8_4_;
        auVar228._12_4_ = fStack_3b4 * auVar225._12_4_;
        auVar228._16_4_ = fStack_3b0 * auVar225._16_4_;
        auVar228._20_4_ = fStack_3ac * auVar225._20_4_;
        auVar228._28_36_ = auVar225._28_36_;
        auVar228._24_4_ = fStack_3a8 * auVar225._24_4_;
        auVar71 = vfmadd231ps_fma(auVar228._0_32_,local_3a0,auVar82);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_380,auVar98);
        _local_200 = local_360;
        local_1e0 = vminps_avx(local_2a0,auVar123);
        auVar226._8_4_ = 0x7fffffff;
        auVar226._0_8_ = 0x7fffffff7fffffff;
        auVar226._12_4_ = 0x7fffffff;
        auVar226._16_4_ = 0x7fffffff;
        auVar226._20_4_ = 0x7fffffff;
        auVar226._24_4_ = 0x7fffffff;
        auVar226._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(ZEXT1632(auVar71),auVar226);
        _local_2c0 = vmaxps_avx(local_360,auVar124);
        auVar227._8_4_ = 0x3e99999a;
        auVar227._0_8_ = 0x3e99999a3e99999a;
        auVar227._12_4_ = 0x3e99999a;
        auVar227._16_4_ = 0x3e99999a;
        auVar227._20_4_ = 0x3e99999a;
        auVar227._24_4_ = 0x3e99999a;
        auVar227._28_4_ = 0x3e99999a;
        uVar15 = vcmpps_avx512vl(auVar93,auVar227,1);
        uVar17 = vcmpps_avx512vl(local_360,local_1e0,2);
        bVar61 = (byte)uVar17 & bVar57;
        uVar16 = vcmpps_avx512vl(_local_2c0,local_2a0,2);
        if ((bVar57 & ((byte)uVar16 | (byte)uVar17)) == 0) {
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar247 = ZEXT3264(auVar93);
          auVar212 = ZEXT3264(_DAT_01f7b040);
          auVar244 = ZEXT3264(local_740);
          auVar245 = ZEXT3264(local_760);
          auVar239 = ZEXT3264(local_780);
          auVar228 = ZEXT3264(local_700);
          auVar225 = ZEXT3264(local_720);
          auVar230 = ZEXT3264(local_7a0);
          auVar235 = ZEXT3264(local_7c0);
        }
        else {
          _local_340 = _local_2c0;
          local_890 = (uint)(byte)((byte)uVar15 | ~bVar62);
          auVar49._4_4_ = (float)local_3c0._4_4_ * auVar234._4_4_;
          auVar49._0_4_ = (float)local_3c0._0_4_ * auVar234._0_4_;
          auVar49._8_4_ = fStack_3b8 * auVar234._8_4_;
          auVar49._12_4_ = fStack_3b4 * auVar234._12_4_;
          auVar49._16_4_ = fStack_3b0 * auVar234._16_4_;
          auVar49._20_4_ = fStack_3ac * auVar234._20_4_;
          auVar49._24_4_ = fStack_3a8 * auVar234._24_4_;
          auVar49._28_4_ = local_2c0._28_4_;
          auVar71 = vfmadd213ps_fma(auVar99,local_3a0,auVar49);
          auVar71 = vfmadd213ps_fma(auVar97,local_380,ZEXT1632(auVar71));
          auVar93 = vandps_avx(ZEXT1632(auVar71),auVar226);
          uVar15 = vcmpps_avx512vl(auVar93,auVar227,1);
          bVar62 = (byte)uVar15 | ~bVar62;
          auVar143._8_4_ = 2;
          auVar143._0_8_ = 0x200000002;
          auVar143._12_4_ = 2;
          auVar143._16_4_ = 2;
          auVar143._20_4_ = 2;
          auVar143._24_4_ = 2;
          auVar143._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar143,auVar31);
          local_280._0_4_ = (uint)(bVar62 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
          bVar64 = (bool)(bVar62 >> 1 & 1);
          local_280._4_4_ = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar62 >> 2 & 1);
          local_280._8_4_ = (uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar62 >> 3 & 1);
          local_280._12_4_ = (uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar62 >> 4 & 1);
          local_280._16_4_ = (uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar62 >> 5 & 1);
          local_280._20_4_ = (uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar62 >> 6 & 1);
          local_280._24_4_ = (uint)bVar64 * auVar93._24_4_ | (uint)!bVar64 * 2;
          local_280._28_4_ = (uint)(bVar62 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
          local_2e0 = vpbroadcastd_avx512vl();
          uVar15 = vpcmpd_avx512vl(local_2e0,local_280,5);
          local_88c = (uint)bVar61;
          local_320 = local_360._0_4_ + (float)local_680._0_4_;
          fStack_31c = local_360._4_4_ + (float)local_680._4_4_;
          fStack_318 = local_360._8_4_ + fStack_678;
          fStack_314 = local_360._12_4_ + fStack_674;
          fStack_310 = local_360._16_4_ + fStack_670;
          fStack_30c = local_360._20_4_ + fStack_66c;
          fStack_308 = local_360._24_4_ + fStack_668;
          fStack_304 = local_360._28_4_ + fStack_664;
          for (bVar61 = (byte)uVar15 & bVar61; auVar93 = _local_860, bVar61 != 0;
              bVar61 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar61 & (byte)uVar15) {
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar82 = vblendmps_avx512vl(auVar144,local_360);
            auVar125._0_4_ =
                 (uint)(bVar61 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 1 & 1);
            auVar125._4_4_ = (uint)bVar64 * auVar82._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 2 & 1);
            auVar125._8_4_ = (uint)bVar64 * auVar82._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 3 & 1);
            auVar125._12_4_ = (uint)bVar64 * auVar82._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 4 & 1);
            auVar125._16_4_ = (uint)bVar64 * auVar82._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 5 & 1);
            auVar125._20_4_ = (uint)bVar64 * auVar82._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar61 >> 6 & 1);
            auVar125._24_4_ = (uint)bVar64 * auVar82._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar125._28_4_ =
                 (uint)(bVar61 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar61 >> 7) * 0x7f800000;
            auVar82 = vshufps_avx(auVar125,auVar125,0xb1);
            auVar82 = vminps_avx(auVar125,auVar82);
            auVar80 = vshufpd_avx(auVar82,auVar82,5);
            auVar82 = vminps_avx(auVar82,auVar80);
            auVar80 = vpermpd_avx2(auVar82,0x4e);
            auVar82 = vminps_avx(auVar82,auVar80);
            uVar15 = vcmpps_avx512vl(auVar125,auVar82,0);
            bVar58 = (byte)uVar15 & bVar61;
            bVar62 = bVar61;
            if (bVar58 != 0) {
              bVar62 = bVar58;
            }
            iVar2 = 0;
            for (uVar68 = (uint)bVar62; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar212 = ZEXT464(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            fVar166 = local_888;
            fVar150 = *(float *)(local_1a0 + (uint)(iVar2 << 2));
            uVar152 = 0;
            uVar231 = 0;
            uVar232 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416((uint)*(float *)(local_1a0 + (uint)(iVar2 << 2)));
              local_6e0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar61;
              stack0xfffffffffffff7a2 = auVar93._2_30_;
              auVar243 = ZEXT1664(auVar243._0_16_);
              fVar166 = sqrtf((float)local_6a0._0_4_);
              bVar61 = local_860[0];
              auVar212 = ZEXT1664(local_6e0._0_16_);
              fVar150 = (float)local_880._0_4_;
              uVar152 = local_880._4_4_;
              uVar231 = local_880._8_4_;
              uVar232 = local_880._12_4_;
            }
            auVar72 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar71 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar73 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar74 = vminps_avx(auVar72,auVar73);
            auVar72 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar73 = vmaxps_avx(auVar71,auVar72);
            auVar200._8_4_ = 0x7fffffff;
            auVar200._0_8_ = 0x7fffffff7fffffff;
            auVar200._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar74,auVar200);
            auVar72 = vandps_avx(auVar73,auVar200);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            local_540._0_4_ = auVar71._0_4_ * 1.9073486e-06;
            local_600 = vshufps_avx(auVar73,auVar73,0xff);
            lVar63 = 5;
            do {
              do {
                auVar93 = local_880;
                bVar64 = lVar63 == 0;
                lVar63 = lVar63 + -1;
                if (bVar64) goto LAB_0199fab9;
                uVar233 = auVar212._0_4_;
                auVar137._4_4_ = uVar233;
                auVar137._0_4_ = uVar233;
                auVar137._8_4_ = uVar233;
                auVar137._12_4_ = uVar233;
                auVar72 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_690);
                fVar168 = 1.0 - fVar150;
                auVar177._0_4_ = local_5a0._0_4_ * fVar150;
                auVar177._4_4_ = local_5a0._4_4_ * fVar150;
                auVar177._8_4_ = local_5a0._8_4_ * fVar150;
                auVar177._12_4_ = local_5a0._12_4_ * fVar150;
                local_4e0._0_16_ = ZEXT416((uint)fVar168);
                auVar201._4_4_ = fVar168;
                auVar201._0_4_ = fVar168;
                auVar201._8_4_ = fVar168;
                auVar201._12_4_ = fVar168;
                auVar71 = vfmadd231ps_fma(auVar177,auVar201,local_560._0_16_);
                auVar205._0_4_ = local_580._0_4_ * fVar150;
                auVar205._4_4_ = local_580._4_4_ * fVar150;
                auVar205._8_4_ = local_580._8_4_ * fVar150;
                auVar205._12_4_ = local_580._12_4_ * fVar150;
                auVar73 = vfmadd231ps_fma(auVar205,auVar201,local_5a0._0_16_);
                auVar214._0_4_ = fVar150 * (float)local_5c0._0_4_;
                auVar214._4_4_ = fVar150 * (float)local_5c0._4_4_;
                auVar214._8_4_ = fVar150 * fStack_5b8;
                auVar214._12_4_ = fVar150 * fStack_5b4;
                auVar74 = vfmadd231ps_fma(auVar214,auVar201,local_580._0_16_);
                auVar221._0_4_ = fVar150 * auVar73._0_4_;
                auVar221._4_4_ = fVar150 * auVar73._4_4_;
                auVar221._8_4_ = fVar150 * auVar73._8_4_;
                auVar221._12_4_ = fVar150 * auVar73._12_4_;
                auVar71 = vfmadd231ps_fma(auVar221,auVar201,auVar71);
                auVar178._0_4_ = fVar150 * auVar74._0_4_;
                auVar178._4_4_ = fVar150 * auVar74._4_4_;
                auVar178._8_4_ = fVar150 * auVar74._8_4_;
                auVar178._12_4_ = fVar150 * auVar74._12_4_;
                auVar73 = vfmadd231ps_fma(auVar178,auVar201,auVar73);
                auVar206._0_4_ = fVar150 * auVar73._0_4_;
                auVar206._4_4_ = fVar150 * auVar73._4_4_;
                auVar206._8_4_ = fVar150 * auVar73._8_4_;
                auVar206._12_4_ = fVar150 * auVar73._12_4_;
                auVar74 = vfmadd231ps_fma(auVar206,auVar71,auVar201);
                auVar71 = vsubps_avx(auVar73,auVar71);
                auVar19._8_4_ = 0x40400000;
                auVar19._0_8_ = 0x4040000040400000;
                auVar19._12_4_ = 0x40400000;
                auVar73 = vmulps_avx512vl(auVar71,auVar19);
                _local_4c0 = auVar74;
                auVar72 = vsubps_avx(auVar72,auVar74);
                auVar71 = vdpps_avx(auVar72,auVar72,0x7f);
                local_880._4_4_ = uVar152;
                local_880._0_4_ = fVar150;
                local_880._8_4_ = uVar231;
                local_880._16_16_ = auVar93._16_16_;
                local_880._12_4_ = uVar232;
                local_6e0._0_16_ = auVar212._0_16_;
                _local_860 = auVar73;
                _local_6c0 = auVar72;
                local_840._0_16_ = auVar71;
                if (auVar71._0_4_ < 0.0) {
                  auVar230._0_4_ = sqrtf(auVar71._0_4_);
                  auVar230._4_60_ = extraout_var;
                  auVar71 = auVar230._0_16_;
                  auVar73 = _local_860;
                }
                else {
                  auVar71 = vsqrtss_avx(auVar71,auVar71);
                }
                local_660._0_16_ = vdpps_avx(auVar73,auVar73,0x7f);
                fVar150 = local_660._0_4_;
                auVar179._4_12_ = ZEXT812(0) << 0x20;
                auVar179._0_4_ = fVar150;
                auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
                local_500._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar69 = vxorps_avx512vl(local_660._0_16_,auVar20);
                auVar72 = vfnmadd213ss_fma(local_500._0_16_,local_660._0_16_,ZEXT416(0x40000000));
                local_520._0_4_ = auVar72._0_4_;
                local_640._0_4_ = auVar71._0_4_;
                if (fVar150 < auVar69._0_4_) {
                  local_7f0 = auVar74;
                  auVar235._0_4_ = sqrtf(fVar150);
                  auVar235._4_60_ = extraout_var_00;
                  auVar71 = ZEXT416((uint)local_640._0_4_);
                  auVar69 = auVar235._0_16_;
                  auVar72 = local_7f0;
                  auVar73 = _local_860;
                }
                else {
                  auVar69 = vsqrtss_avx512f(local_660._0_16_,local_660._0_16_);
                  auVar72 = auVar74;
                }
                fVar168 = auVar72._0_4_;
                fVar150 = auVar74._0_4_ * 1.5 + fVar150 * -0.5 * fVar168 * fVar168 * fVar168;
                auVar222._0_4_ = auVar73._0_4_ * fVar150;
                auVar222._4_4_ = auVar73._4_4_ * fVar150;
                auVar222._8_4_ = auVar73._8_4_ * fVar150;
                auVar222._12_4_ = auVar73._12_4_ * fVar150;
                auVar72 = vdpps_avx(_local_6c0,auVar222,0x7f);
                fVar168 = auVar71._0_4_ + 1.0;
                fVar170 = auVar72._0_4_;
                auVar138._0_4_ = fVar170 * fVar170;
                auVar138._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                auVar138._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                auVar138._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                auVar74 = vsubps_avx(local_840._0_16_,auVar138);
                fVar136 = auVar74._0_4_;
                auVar153._4_12_ = ZEXT812(0) << 0x20;
                auVar153._0_4_ = fVar136;
                auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar153);
                auVar76 = vmulss_avx512f(auVar75,ZEXT416(0x3fc00000));
                auVar70 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
                if (fVar136 < 0.0) {
                  local_7f0._0_4_ = fVar168;
                  local_5f0 = fVar150;
                  fStack_5ec = fVar150;
                  fStack_5e8 = fVar150;
                  fStack_5e4 = fVar150;
                  local_5e0 = auVar222;
                  local_5d0 = auVar75;
                  fVar136 = sqrtf(fVar136);
                  auVar70 = ZEXT416(auVar70._0_4_);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar69 = ZEXT416(auVar69._0_4_);
                  auVar71 = ZEXT416((uint)local_640._0_4_);
                  auVar222 = local_5e0;
                  fVar168 = (float)local_7f0._0_4_;
                  auVar73 = _local_860;
                  auVar75 = local_5d0;
                  fVar150 = local_5f0;
                  fVar199 = fStack_5ec;
                  fVar173 = fStack_5e8;
                  fVar175 = fStack_5e4;
                }
                else {
                  auVar74 = vsqrtss_avx(auVar74,auVar74);
                  fVar136 = auVar74._0_4_;
                  fVar199 = fVar150;
                  fVar173 = fVar150;
                  fVar175 = fVar150;
                }
                auVar243 = ZEXT1664(auVar72);
                auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,
                                          local_4e0._0_16_);
                fVar151 = auVar74._0_4_ * 6.0;
                fVar167 = local_880._0_4_ * 6.0;
                auVar180._0_4_ = fVar167 * (float)local_5c0._0_4_;
                auVar180._4_4_ = fVar167 * (float)local_5c0._4_4_;
                auVar180._8_4_ = fVar167 * fStack_5b8;
                auVar180._12_4_ = fVar167 * fStack_5b4;
                auVar154._4_4_ = fVar151;
                auVar154._0_4_ = fVar151;
                auVar154._8_4_ = fVar151;
                auVar154._12_4_ = fVar151;
                auVar74 = vfmadd132ps_fma(auVar154,auVar180,local_580._0_16_);
                auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                          local_880._0_16_);
                fVar151 = auVar79._0_4_ * 6.0;
                auVar181._4_4_ = fVar151;
                auVar181._0_4_ = fVar151;
                auVar181._8_4_ = fVar151;
                auVar181._12_4_ = fVar151;
                auVar74 = vfmadd132ps_fma(auVar181,auVar74,local_5a0._0_16_);
                fVar151 = local_4e0._0_4_ * 6.0;
                auVar155._4_4_ = fVar151;
                auVar155._0_4_ = fVar151;
                auVar155._8_4_ = fVar151;
                auVar155._12_4_ = fVar151;
                auVar74 = vfmadd132ps_fma(auVar155,auVar74,local_560._0_16_);
                auVar182._0_4_ = auVar74._0_4_ * (float)local_660._0_4_;
                auVar182._4_4_ = auVar74._4_4_ * (float)local_660._0_4_;
                auVar182._8_4_ = auVar74._8_4_ * (float)local_660._0_4_;
                auVar182._12_4_ = auVar74._12_4_ * (float)local_660._0_4_;
                auVar74 = vdpps_avx(auVar73,auVar74,0x7f);
                fVar151 = auVar74._0_4_;
                auVar156._0_4_ = auVar73._0_4_ * fVar151;
                auVar156._4_4_ = auVar73._4_4_ * fVar151;
                auVar156._8_4_ = auVar73._8_4_ * fVar151;
                auVar156._12_4_ = auVar73._12_4_ * fVar151;
                auVar74 = vsubps_avx(auVar182,auVar156);
                fVar151 = (float)local_520._0_4_ * (float)local_500._0_4_;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar77 = vxorps_avx512vl(auVar73,auVar21);
                auVar207._0_4_ = fVar150 * auVar74._0_4_ * fVar151;
                auVar207._4_4_ = fVar199 * auVar74._4_4_ * fVar151;
                auVar207._8_4_ = fVar173 * auVar74._8_4_ * fVar151;
                auVar207._12_4_ = fVar175 * auVar74._12_4_ * fVar151;
                auVar74 = vdpps_avx(auVar77,auVar222,0x7f);
                auVar79 = vmaxss_avx(ZEXT416((uint)local_540._0_4_),
                                     ZEXT416((uint)((float)local_6e0._0_4_ * fVar166 * 1.9073486e-06
                                                   )));
                auVar78 = vdivss_avx512f(ZEXT416((uint)local_540._0_4_),auVar69);
                auVar69 = vdpps_avx(_local_6c0,auVar207,0x7f);
                auVar71 = vfmadd213ss_fma(auVar71,ZEXT416((uint)local_540._0_4_),auVar79);
                auVar78 = vfmadd213ss_fma(ZEXT416((uint)fVar168),auVar78,auVar71);
                auVar71 = vdpps_avx(local_690,auVar222,0x7f);
                fVar168 = auVar74._0_4_ + auVar69._0_4_;
                auVar74 = vdpps_avx(_local_6c0,auVar77,0x7f);
                auVar70 = vmulss_avx512f(auVar70,auVar75);
                auVar75 = vmulss_avx512f(auVar75,auVar75);
                auVar69 = vdpps_avx(_local_6c0,local_690,0x7f);
                auVar70 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar70._0_4_ * auVar75._0_4_)));
                auVar75 = vfnmadd231ss_fma(auVar74,auVar72,ZEXT416((uint)fVar168));
                auVar76 = vfnmadd231ss_fma(auVar69,auVar72,auVar71);
                auVar74 = vpermilps_avx(_local_4c0,0xff);
                fVar136 = fVar136 - auVar74._0_4_;
                auVar74 = vshufps_avx(auVar73,auVar73,0xff);
                auVar69 = vfmsub213ss_fma(auVar75,auVar70,auVar74);
                fVar150 = auVar76._0_4_ * auVar70._0_4_;
                auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar69._0_4_)),
                                          ZEXT416((uint)fVar168),ZEXT416((uint)fVar150));
                fVar199 = auVar75._0_4_;
                fVar150 = local_880._0_4_ -
                          (fVar170 * (fVar150 / fVar199) - fVar136 * (auVar71._0_4_ / fVar199));
                uVar152 = 0;
                uVar231 = 0;
                uVar232 = 0;
                fVar168 = (float)local_6e0._0_4_ -
                          (fVar136 * (fVar168 / fVar199) - fVar170 * (auVar69._0_4_ / fVar199));
                auVar212 = ZEXT464((uint)fVar168);
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar71 = vandps_avx512vl(auVar72,auVar22);
              } while (auVar78._0_4_ <= auVar71._0_4_);
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar79._0_4_)),local_600,
                                        ZEXT416(0x36000000));
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar69 = vandps_avx512vl(ZEXT416((uint)fVar136),auVar23);
            } while (auVar71._0_4_ <= auVar69._0_4_);
            fVar168 = fVar168 + (float)local_610._0_4_;
            if ((((fVar135 <= fVar168) &&
                 (fVar166 = pre->ray_space[2].vy.field_0.m128[(long)ray], fVar168 <= fVar166)) &&
                (0.0 <= fVar150)) && (fVar150 <= 1.0)) {
              auVar183._4_12_ = SUB1612(ZEXT816(0),0);
              auVar183._0_4_ = local_840._0_4_;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar183);
              fVar170 = auVar71._0_4_;
              lVar63 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar149 * 8);
              if ((*(uint *)(lVar63 + 0x34) & (uint)pre->ray_space[2].vz.field_0.m128[(long)ray]) !=
                  0) {
                fVar170 = fVar170 * 1.5 + local_840._0_4_ * -0.5 * fVar170 * fVar170 * fVar170;
                auVar184._0_4_ = local_6c0._0_4_ * fVar170;
                auVar184._4_4_ = local_6c0._4_4_ * fVar170;
                auVar184._8_4_ = local_6c0._8_4_ * fVar170;
                auVar184._12_4_ = local_6c0._12_4_ * fVar170;
                auVar69 = vfmadd213ps_fma(auVar74,auVar184,auVar73);
                auVar71 = vshufps_avx(auVar184,auVar184,0xc9);
                auVar74 = vshufps_avx(auVar73,auVar73,0xc9);
                auVar185._0_4_ = auVar184._0_4_ * auVar74._0_4_;
                auVar185._4_4_ = auVar184._4_4_ * auVar74._4_4_;
                auVar185._8_4_ = auVar184._8_4_ * auVar74._8_4_;
                auVar185._12_4_ = auVar184._12_4_ * auVar74._12_4_;
                auVar74 = vfmsub231ps_fma(auVar185,auVar73,auVar71);
                auVar71 = vshufps_avx(auVar74,auVar74,0xc9);
                auVar73 = vshufps_avx(auVar69,auVar69,0xc9);
                auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                auVar139._0_4_ = auVar69._0_4_ * auVar74._0_4_;
                auVar139._4_4_ = auVar69._4_4_ * auVar74._4_4_;
                auVar139._8_4_ = auVar69._8_4_ * auVar74._8_4_;
                auVar139._12_4_ = auVar69._12_4_ * auVar74._12_4_;
                auVar71 = vfmsub231ps_fma(auVar139,auVar71,auVar73);
                fVar170 = auVar71._0_4_;
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar63 + 0x40) == 0))
                {
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar168;
                  fVar166 = (float)vextractps_avx(auVar71,1);
                  pre->ray_space[3].vz.field_0.m128[(long)ray] = fVar166;
                  uVar152 = vextractps_avx(auVar71,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x10) = uVar152;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar170;
                  pre[1].ray_space[0].vy.field_0.m128[(long)ray] = fVar150;
                  pre[1].ray_space[0].vz.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[1].vx.field_0.m128[(long)ray] = fVar242;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar149;
                  pre[1].ray_space[1].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[2].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  local_460._0_16_ = vshufps_avx(auVar71,auVar71,0x55);
                  local_460._16_16_ = vshufps_avx(auVar71,auVar71,0xaa);
                  local_440 = fVar170;
                  fStack_43c = fVar170;
                  fStack_438 = fVar170;
                  fStack_434 = fVar170;
                  local_430 = fVar150;
                  fStack_42c = fVar150;
                  fStack_428 = fVar150;
                  fStack_424 = fVar150;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = **(undefined4 **)(k + 8);
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = (*(undefined4 **)(k + 8))[1];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar168;
                  local_8b0 = local_490;
                  local_820 = local_8b0;
                  local_818 = *(undefined8 *)(lVar63 + 0x18);
                  local_810 = *(undefined8 *)(k + 8);
                  local_800 = (int *)local_460;
                  local_7f8 = 4;
                  local_880._0_4_ = fVar166;
                  local_808 = pre;
                  if (*(code **)(lVar63 + 0x40) != (code *)0x0) {
                    auVar243 = ZEXT1664(auVar72);
                    (**(code **)(lVar63 + 0x40))(&local_820);
                    fVar166 = (float)local_880._0_4_;
                  }
                  uVar67 = vptestmd_avx512vl(local_8b0,local_8b0);
                  if ((uVar67 & 0xf) != 0) {
                    pcVar7 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar7 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar63 + 0x3e) & 0x40) != 0)))) {
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      (*pcVar7)(&local_820);
                      fVar166 = (float)local_880._0_4_;
                    }
                    uVar67 = vptestmd_avx512vl(local_8b0,local_8b0);
                    uVar67 = uVar67 & 0xf;
                    bVar62 = (byte)uVar67;
                    if (bVar62 != 0) {
                      iVar3 = local_800[1];
                      iVar4 = local_800[2];
                      iVar1 = local_800[3];
                      pVVar5 = &local_808->ray_space[3].vz;
                      iVar51 = *(int *)((long)&local_808->ray_space[3].vz.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808->ray_space[3].vz.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808->ray_space[3].vz.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar62 & 1) * *local_800 |
                                  (uint)!(bool)(bVar62 & 1) * *(int *)&pVVar5->field_0);
                      local_808->ray_space[3].vz.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808->ray_space[3].vz.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808->ray_space[3].vz.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      iVar3 = local_800[5];
                      iVar4 = local_800[6];
                      iVar1 = local_800[7];
                      iVar51 = local_808[1].depth_scale.field_0.i[1];
                      iVar52 = local_808[1].depth_scale.field_0.i[2];
                      iVar53 = local_808[1].depth_scale.field_0.i[3];
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      local_808[1].depth_scale.field_0.i[0] =
                           (uint)(bVar62 & 1) * local_800[4] |
                           (uint)!(bool)(bVar62 & 1) * local_808[1].depth_scale.field_0.i[0];
                      local_808[1].depth_scale.field_0.i[1] =
                           (uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51;
                      local_808[1].depth_scale.field_0.i[2] =
                           (uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52;
                      local_808[1].depth_scale.field_0.i[3] =
                           (uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53;
                      iVar3 = local_800[9];
                      iVar4 = local_800[10];
                      iVar1 = local_800[0xb];
                      iVar51 = *(int *)((long)&local_808[1].ray_space[0].vx.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808[1].ray_space[0].vx.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808[1].ray_space[0].vx.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      local_808[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar62 & 1) * local_800[8] |
                                  (uint)!(bool)(bVar62 & 1) *
                                  *(int *)&local_808[1].ray_space[0].vx.field_0);
                      local_808[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      iVar3 = local_800[0xd];
                      iVar4 = local_800[0xe];
                      iVar1 = local_800[0xf];
                      pVVar5 = &local_808[1].ray_space[0].vy;
                      iVar51 = *(int *)((long)&local_808[1].ray_space[0].vy.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808[1].ray_space[0].vy.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808[1].ray_space[0].vy.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar62 & 1) * local_800[0xc] |
                                  (uint)!(bool)(bVar62 & 1) * *(int *)&pVVar5->field_0);
                      local_808[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      iVar3 = local_800[0x11];
                      iVar4 = local_800[0x12];
                      iVar1 = local_800[0x13];
                      pVVar5 = &local_808[1].ray_space[0].vz;
                      iVar51 = *(int *)((long)&local_808[1].ray_space[0].vz.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808[1].ray_space[0].vz.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808[1].ray_space[0].vz.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar62 & 1) * local_800[0x10] |
                                  (uint)!(bool)(bVar62 & 1) * *(int *)&pVVar5->field_0);
                      local_808[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x14));
                      local_808[1].ray_space[1].vx.field_0 = aVar6;
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x18));
                      local_808[1].ray_space[1].vy.field_0 = aVar6;
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x1c));
                      local_808[1].ray_space[1].vz.field_0 = aVar6;
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x20));
                      local_808[1].ray_space[2].vx.field_0 = aVar6;
                      goto LAB_0199fab9;
                    }
                  }
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar166;
                }
              }
            }
LAB_0199fab9:
            uVar152 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
            auVar217._4_4_ = uVar152;
            auVar217._0_4_ = uVar152;
            auVar217._8_4_ = uVar152;
            auVar217._12_4_ = uVar152;
            auVar217._16_4_ = uVar152;
            auVar217._20_4_ = uVar152;
            auVar217._24_4_ = uVar152;
            auVar217._28_4_ = uVar152;
            auVar212 = ZEXT3264(auVar217);
            auVar54._4_4_ = fStack_31c;
            auVar54._0_4_ = local_320;
            auVar54._8_4_ = fStack_318;
            auVar54._12_4_ = fStack_314;
            auVar54._16_4_ = fStack_310;
            auVar54._20_4_ = fStack_30c;
            auVar54._24_4_ = fStack_308;
            auVar54._28_4_ = fStack_304;
            uVar15 = vcmpps_avx512vl(auVar217,auVar54,0xd);
          }
          auVar145._0_4_ = (float)local_680._0_4_ + (float)local_340._0_4_;
          auVar145._4_4_ = (float)local_680._4_4_ + (float)local_340._4_4_;
          auVar145._8_4_ = fStack_678 + fStack_338;
          auVar145._12_4_ = fStack_674 + fStack_334;
          auVar145._16_4_ = fStack_670 + fStack_330;
          auVar145._20_4_ = fStack_66c + fStack_32c;
          auVar145._24_4_ = fStack_668 + fStack_328;
          auVar145._28_4_ = fStack_664 + fStack_324;
          uVar152 = auVar212._0_4_;
          auVar162._4_4_ = uVar152;
          auVar162._0_4_ = uVar152;
          auVar162._8_4_ = uVar152;
          auVar162._12_4_ = uVar152;
          auVar162._16_4_ = uVar152;
          auVar162._20_4_ = uVar152;
          auVar162._24_4_ = uVar152;
          auVar162._28_4_ = uVar152;
          uVar15 = vcmpps_avx512vl(auVar145,auVar162,2);
          auVar146._8_4_ = 2;
          auVar146._0_8_ = 0x200000002;
          auVar146._12_4_ = 2;
          auVar146._16_4_ = 2;
          auVar146._20_4_ = 2;
          auVar146._24_4_ = 2;
          auVar146._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar146,auVar32);
          bVar64 = (bool)((byte)local_890 & 1);
          local_340._0_4_ = (uint)bVar64 * auVar93._0_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)((byte)(local_890 >> 1) & 1);
          local_340._4_4_ = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)((byte)(local_890 >> 2) & 1);
          fStack_338 = (float)((uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_890 >> 3) & 1);
          fStack_334 = (float)((uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_890 >> 4) & 1);
          fStack_330 = (float)((uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_890 >> 5) & 1);
          fStack_32c = (float)((uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_890 >> 6) & 1);
          fStack_328 = (float)((uint)bVar64 * auVar93._24_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)((byte)(local_890 >> 7) & 1);
          fStack_324 = (float)((uint)bVar64 * auVar93._28_4_ | (uint)!bVar64 * 2);
          bVar57 = (byte)uVar16 & bVar57 & (byte)uVar15;
          uVar15 = vpcmpd_avx512vl(_local_340,local_2e0,2);
          local_360 = _local_2c0;
          local_320 = (float)local_680._0_4_ + (float)local_2c0._0_4_;
          fStack_31c = (float)local_680._4_4_ + (float)local_2c0._4_4_;
          fStack_318 = fStack_678 + fStack_2b8;
          fStack_314 = fStack_674 + fStack_2b4;
          fStack_310 = fStack_670 + fStack_2b0;
          fStack_30c = fStack_66c + fStack_2ac;
          fStack_308 = fStack_668 + fStack_2a8;
          fStack_304 = fStack_664 + fStack_2a4;
          auVar244 = ZEXT3264(local_740);
          auVar245 = ZEXT3264(local_760);
          auVar239 = ZEXT3264(local_780);
          auVar228 = ZEXT3264(local_700);
          auVar225 = ZEXT3264(local_720);
          auVar230 = ZEXT3264(local_7a0);
          auVar235 = ZEXT3264(local_7c0);
          for (bVar62 = (byte)uVar15 & bVar57; auVar93 = _local_860, bVar62 != 0;
              bVar62 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar62 & (byte)uVar15) {
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar82 = vblendmps_avx512vl(auVar147,local_360);
            auVar126._0_4_ =
                 (uint)(bVar62 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar64 * auVar82._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar64 * auVar82._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar64 * auVar82._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar64 * auVar82._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar64 * auVar82._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 6 & 1);
            auVar126._24_4_ = (uint)bVar64 * auVar82._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar126._28_4_ =
                 (uint)(bVar62 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar62 >> 7) * 0x7f800000;
            auVar82 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar82 = vminps_avx(auVar126,auVar82);
            auVar80 = vshufpd_avx(auVar82,auVar82,5);
            auVar82 = vminps_avx(auVar82,auVar80);
            auVar80 = vpermpd_avx2(auVar82,0x4e);
            auVar82 = vminps_avx(auVar82,auVar80);
            uVar15 = vcmpps_avx512vl(auVar126,auVar82,0);
            bVar58 = (byte)uVar15 & bVar62;
            bVar61 = bVar62;
            if (bVar58 != 0) {
              bVar61 = bVar58;
            }
            iVar2 = 0;
            for (uVar68 = (uint)bVar61; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            auVar243 = ZEXT464(*(uint *)(local_2a0 + (uint)(iVar2 << 2)));
            fVar166 = local_884;
            fVar150 = *(float *)(local_1c0 + (uint)(iVar2 << 2));
            uVar152 = 0;
            uVar231 = 0;
            uVar232 = 0;
            if ((float)local_6a0._0_4_ < 0.0) {
              local_840._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar2 << 2)));
              local_880._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar2 << 2)));
              local_860[1] = 0;
              local_860[0] = bVar62;
              stack0xfffffffffffff7a2 = auVar93._2_30_;
              fVar166 = sqrtf((float)local_6a0._0_4_);
              bVar62 = local_860[0];
              auVar243 = ZEXT1664(local_880._0_16_);
              auVar235 = ZEXT3264(local_7c0);
              auVar230 = ZEXT3264(local_7a0);
              auVar225 = ZEXT3264(local_720);
              auVar228 = ZEXT3264(local_700);
              auVar239 = ZEXT3264(local_780);
              auVar245 = ZEXT3264(local_760);
              auVar244 = ZEXT3264(local_740);
              fVar150 = (float)local_840._0_4_;
              uVar152 = local_840._4_4_;
              uVar231 = local_840._8_4_;
              uVar232 = local_840._12_4_;
            }
            auVar72 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar71 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
            auVar73 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar74 = vminps_avx(auVar72,auVar73);
            auVar72 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
            auVar73 = vmaxps_avx(auVar71,auVar72);
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar74,auVar202);
            auVar72 = vandps_avx(auVar73,auVar202);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar168 = auVar71._0_4_ * 1.9073486e-06;
            local_7f0._0_4_ = fVar166 * 1.9073486e-06;
            local_600 = vshufps_avx(auVar73,auVar73,0xff);
            lVar63 = 5;
            do {
              do {
                auVar93 = local_840;
                bVar64 = lVar63 == 0;
                lVar63 = lVar63 + -1;
                if (bVar64) goto LAB_019a072a;
                uVar233 = auVar243._0_4_;
                auVar140._4_4_ = uVar233;
                auVar140._0_4_ = uVar233;
                auVar140._8_4_ = uVar233;
                auVar140._12_4_ = uVar233;
                auVar72 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_690);
                fVar166 = 1.0 - fVar150;
                auVar186._0_4_ = local_5a0._0_4_ * fVar150;
                auVar186._4_4_ = local_5a0._4_4_ * fVar150;
                auVar186._8_4_ = local_5a0._8_4_ * fVar150;
                auVar186._12_4_ = local_5a0._12_4_ * fVar150;
                local_4e0._0_16_ = ZEXT416((uint)fVar166);
                auVar203._4_4_ = fVar166;
                auVar203._0_4_ = fVar166;
                auVar203._8_4_ = fVar166;
                auVar203._12_4_ = fVar166;
                auVar71 = vfmadd231ps_fma(auVar186,auVar203,local_560._0_16_);
                auVar208._0_4_ = local_580._0_4_ * fVar150;
                auVar208._4_4_ = local_580._4_4_ * fVar150;
                auVar208._8_4_ = local_580._8_4_ * fVar150;
                auVar208._12_4_ = local_580._12_4_ * fVar150;
                auVar73 = vfmadd231ps_fma(auVar208,auVar203,local_5a0._0_16_);
                auVar215._0_4_ = fVar150 * (float)local_5c0._0_4_;
                auVar215._4_4_ = fVar150 * (float)local_5c0._4_4_;
                auVar215._8_4_ = fVar150 * fStack_5b8;
                auVar215._12_4_ = fVar150 * fStack_5b4;
                auVar74 = vfmadd231ps_fma(auVar215,auVar203,local_580._0_16_);
                auVar223._0_4_ = fVar150 * auVar73._0_4_;
                auVar223._4_4_ = fVar150 * auVar73._4_4_;
                auVar223._8_4_ = fVar150 * auVar73._8_4_;
                auVar223._12_4_ = fVar150 * auVar73._12_4_;
                auVar71 = vfmadd231ps_fma(auVar223,auVar203,auVar71);
                auVar187._0_4_ = fVar150 * auVar74._0_4_;
                auVar187._4_4_ = fVar150 * auVar74._4_4_;
                auVar187._8_4_ = fVar150 * auVar74._8_4_;
                auVar187._12_4_ = fVar150 * auVar74._12_4_;
                auVar73 = vfmadd231ps_fma(auVar187,auVar203,auVar73);
                auVar209._0_4_ = fVar150 * auVar73._0_4_;
                auVar209._4_4_ = fVar150 * auVar73._4_4_;
                auVar209._8_4_ = fVar150 * auVar73._8_4_;
                auVar209._12_4_ = fVar150 * auVar73._12_4_;
                auVar74 = vfmadd231ps_fma(auVar209,auVar71,auVar203);
                auVar71 = vsubps_avx(auVar73,auVar71);
                auVar24._8_4_ = 0x40400000;
                auVar24._0_8_ = 0x4040000040400000;
                auVar24._12_4_ = 0x40400000;
                auVar71 = vmulps_avx512vl(auVar71,auVar24);
                _local_860 = auVar71;
                _local_4c0 = auVar74;
                auVar71 = vsubps_avx(auVar72,auVar74);
                _local_6c0 = auVar71;
                auVar71 = vdpps_avx(auVar71,auVar71,0x7f);
                local_6e0._0_16_ = auVar71;
                local_840._4_4_ = uVar152;
                local_840._0_4_ = fVar150;
                local_840._8_4_ = uVar231;
                local_840._16_16_ = auVar93._16_16_;
                local_840._12_4_ = uVar232;
                local_880._0_16_ = auVar243._0_16_;
                if (auVar71._0_4_ < 0.0) {
                  auVar239._0_4_ = sqrtf(auVar71._0_4_);
                  auVar239._4_60_ = extraout_var_01;
                  auVar71 = auVar239._0_16_;
                }
                else {
                  auVar71 = vsqrtss_avx(auVar71,auVar71);
                }
                local_500._0_16_ = vdpps_avx(_local_860,_local_860,0x7f);
                fVar150 = local_500._0_4_;
                auVar188._4_12_ = ZEXT812(0) << 0x20;
                auVar188._0_4_ = fVar150;
                local_660._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                fVar166 = local_660._0_4_;
                local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar73 = vxorps_avx512vl(local_500._0_16_,auVar25);
                auVar72 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
                local_540._0_4_ = auVar72._0_4_;
                local_640._0_4_ = auVar71._0_4_;
                if (fVar150 < auVar73._0_4_) {
                  fVar170 = sqrtf(fVar150);
                  auVar71 = ZEXT416((uint)local_640._0_4_);
                }
                else {
                  auVar72 = vsqrtss_avx(local_500._0_16_,local_500._0_16_);
                  fVar170 = auVar72._0_4_;
                }
                fVar136 = local_660._0_4_;
                fVar150 = fVar166 * 1.5 + fVar150 * -0.5 * fVar136 * fVar136 * fVar136;
                auVar240._0_4_ = fVar150 * (float)local_860._0_4_;
                auVar240._4_4_ = fVar150 * (float)local_860._4_4_;
                auVar240._8_4_ = fVar150 * fStack_858;
                auVar240._12_4_ = fVar150 * fStack_854;
                local_660._0_16_ = vdpps_avx(auVar240,_local_6c0,0x7f);
                auVar74 = vaddss_avx512f(auVar71,ZEXT416(0x3f800000));
                auVar141._0_4_ = local_660._0_4_ * local_660._0_4_;
                auVar141._4_4_ = local_660._4_4_ * local_660._4_4_;
                auVar141._8_4_ = local_660._8_4_ * local_660._8_4_;
                auVar141._12_4_ = local_660._12_4_ * local_660._12_4_;
                auVar72 = vsubps_avx(local_6e0._0_16_,auVar141);
                fVar166 = auVar72._0_4_;
                auVar157._4_12_ = ZEXT812(0) << 0x20;
                auVar157._0_4_ = fVar166;
                auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar157);
                auVar69 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
                auVar75 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
                uVar66 = fVar166 == 0.0;
                uVar65 = fVar166 < 0.0;
                if ((bool)uVar65) {
                  local_5f0 = fVar150;
                  fStack_5ec = fVar150;
                  fStack_5e8 = fVar150;
                  fStack_5e4 = fVar150;
                  local_5e0 = auVar240;
                  local_5d0 = auVar73;
                  fVar166 = sqrtf(fVar166);
                  auVar75 = ZEXT416(auVar75._0_4_);
                  auVar69 = ZEXT416(auVar69._0_4_);
                  auVar71 = ZEXT416((uint)local_640._0_4_);
                  auVar74 = ZEXT416(auVar74._0_4_);
                  auVar240 = local_5e0;
                  auVar73 = local_5d0;
                  fVar150 = local_5f0;
                  fVar136 = fStack_5ec;
                  fVar199 = fStack_5e8;
                  fVar173 = fStack_5e4;
                }
                else {
                  auVar72 = vsqrtss_avx(auVar72,auVar72);
                  fVar166 = auVar72._0_4_;
                  fVar136 = fVar150;
                  fVar199 = fVar150;
                  fVar173 = fVar150;
                }
                auVar244 = ZEXT3264(local_740);
                auVar245 = ZEXT3264(local_760);
                auVar239 = ZEXT3264(local_780);
                auVar230 = ZEXT3264(local_7a0);
                auVar235 = ZEXT3264(local_7c0);
                auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,
                                          local_4e0._0_16_);
                fVar175 = auVar72._0_4_ * 6.0;
                fVar151 = local_840._0_4_ * 6.0;
                auVar189._0_4_ = fVar151 * (float)local_5c0._0_4_;
                auVar189._4_4_ = fVar151 * (float)local_5c0._4_4_;
                auVar189._8_4_ = fVar151 * fStack_5b8;
                auVar189._12_4_ = fVar151 * fStack_5b4;
                auVar158._4_4_ = fVar175;
                auVar158._0_4_ = fVar175;
                auVar158._8_4_ = fVar175;
                auVar158._12_4_ = fVar175;
                auVar72 = vfmadd132ps_fma(auVar158,auVar189,local_580._0_16_);
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                          local_840._0_16_);
                fVar175 = auVar76._0_4_ * 6.0;
                auVar190._4_4_ = fVar175;
                auVar190._0_4_ = fVar175;
                auVar190._8_4_ = fVar175;
                auVar190._12_4_ = fVar175;
                auVar72 = vfmadd132ps_fma(auVar190,auVar72,local_5a0._0_16_);
                fVar175 = local_4e0._0_4_ * 6.0;
                auVar159._4_4_ = fVar175;
                auVar159._0_4_ = fVar175;
                auVar159._8_4_ = fVar175;
                auVar159._12_4_ = fVar175;
                auVar72 = vfmadd132ps_fma(auVar159,auVar72,local_560._0_16_);
                auVar191._0_4_ = auVar72._0_4_ * (float)local_500._0_4_;
                auVar191._4_4_ = auVar72._4_4_ * (float)local_500._0_4_;
                auVar191._8_4_ = auVar72._8_4_ * (float)local_500._0_4_;
                auVar191._12_4_ = auVar72._12_4_ * (float)local_500._0_4_;
                auVar72 = vdpps_avx(_local_860,auVar72,0x7f);
                fVar175 = auVar72._0_4_;
                auVar160._0_4_ = local_860._0_4_ * fVar175;
                auVar160._4_4_ = local_860._4_4_ * fVar175;
                auVar160._8_4_ = local_860._8_4_ * fVar175;
                auVar160._12_4_ = local_860._12_4_ * fVar175;
                auVar72 = vsubps_avx(auVar191,auVar160);
                fVar175 = (float)local_540._0_4_ * (float)local_520._0_4_;
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar79 = vxorps_avx512vl(_local_860,auVar26);
                auVar210._0_4_ = fVar150 * auVar72._0_4_ * fVar175;
                auVar210._4_4_ = fVar136 * auVar72._4_4_ * fVar175;
                auVar210._8_4_ = fVar199 * auVar72._8_4_ * fVar175;
                auVar210._12_4_ = fVar173 * auVar72._12_4_ * fVar175;
                auVar72 = vdpps_avx(auVar79,auVar240,0x7f);
                auVar70 = vmaxss_avx(ZEXT416((uint)fVar168),
                                     ZEXT416((uint)((float)local_880._0_4_ * (float)local_7f0._0_4_)
                                            ));
                auVar76 = vdpps_avx(_local_6c0,auVar210,0x7f);
                auVar71 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar168),auVar70);
                vfmadd213ss_avx512f(auVar74,ZEXT416((uint)(fVar168 / fVar170)),auVar71);
                auVar71 = vdpps_avx(local_690,auVar240,0x7f);
                fVar170 = auVar72._0_4_ + auVar76._0_4_;
                auVar72 = vdpps_avx(_local_6c0,auVar79,0x7f);
                auVar74 = vmulss_avx512f(auVar75,auVar73);
                auVar75 = vmulss_avx512f(auVar73,auVar73);
                auVar73 = vdpps_avx(_local_6c0,local_690,0x7f);
                auVar75 = vaddss_avx512f(auVar69,ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)));
                auVar74 = vfnmadd231ss_fma(auVar72,local_660._0_16_,ZEXT416((uint)fVar170));
                auVar69 = vfnmadd231ss_fma(auVar73,local_660._0_16_,auVar71);
                auVar72 = vpermilps_avx(_local_4c0,0xff);
                fVar166 = fVar166 - auVar72._0_4_;
                auVar72 = vshufps_avx(_local_860,_local_860,0xff);
                auVar73 = vfmsub213ss_fma(auVar74,auVar75,auVar72);
                fVar150 = auVar69._0_4_ * auVar75._0_4_;
                auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar73._0_4_)),
                                          ZEXT416((uint)fVar170),ZEXT416((uint)fVar150));
                fVar136 = auVar74._0_4_;
                fVar150 = local_840._0_4_ -
                          (local_660._0_4_ * (fVar150 / fVar136) -
                          fVar166 * (auVar71._0_4_ / fVar136));
                uVar152 = 0;
                uVar231 = 0;
                uVar232 = 0;
                fVar170 = (float)local_880._0_4_ -
                          (fVar166 * (fVar170 / fVar136) -
                          local_660._0_4_ * (auVar73._0_4_ / fVar136));
                auVar243 = ZEXT464((uint)fVar170);
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar71 = vandps_avx512vl(local_660._0_16_,auVar27);
                auVar71 = vucomiss_avx512f(auVar71);
                auVar228 = ZEXT3264(local_700);
                auVar225 = ZEXT3264(local_720);
              } while ((bool)uVar65 || (bool)uVar66);
              auVar71 = vaddss_avx512f(auVar70,auVar71);
              auVar71 = vfmadd231ss_fma(auVar71,local_600,ZEXT416(0x36000000));
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar73 = vandps_avx512vl(ZEXT416((uint)fVar166),auVar28);
            } while (auVar71._0_4_ <= auVar73._0_4_);
            fVar166 = fVar170 + (float)local_610._0_4_;
            if ((((fVar135 <= fVar166) &&
                 (fVar168 = pre->ray_space[2].vy.field_0.m128[(long)ray], fVar166 <= fVar168)) &&
                (0.0 <= fVar150)) && (fVar150 <= 1.0)) {
              auVar192._4_12_ = SUB1612(ZEXT816(0),0);
              auVar192._0_4_ = local_6e0._0_4_;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar192);
              fVar136 = auVar71._0_4_;
              lVar63 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar149 * 8);
              if ((*(uint *)(lVar63 + 0x34) & (uint)pre->ray_space[2].vz.field_0.m128[(long)ray]) !=
                  0) {
                fVar136 = fVar136 * 1.5 +
                          (float)local_6e0._0_4_ * -0.5 * fVar136 * fVar136 * fVar136;
                auVar193._0_4_ = fVar136 * (float)local_6c0._0_4_;
                auVar193._4_4_ = fVar136 * (float)local_6c0._4_4_;
                auVar193._8_4_ = fVar136 * fStack_6b8;
                auVar193._12_4_ = fVar136 * fStack_6b4;
                auVar74 = vfmadd213ps_fma(auVar72,auVar193,_local_860);
                auVar71 = vshufps_avx(auVar193,auVar193,0xc9);
                auVar72 = vshufps_avx(_local_860,_local_860,0xc9);
                auVar194._0_4_ = auVar193._0_4_ * auVar72._0_4_;
                auVar194._4_4_ = auVar193._4_4_ * auVar72._4_4_;
                auVar194._8_4_ = auVar193._8_4_ * auVar72._8_4_;
                auVar194._12_4_ = auVar193._12_4_ * auVar72._12_4_;
                auVar73 = vfmsub231ps_fma(auVar194,_local_860,auVar71);
                auVar71 = vshufps_avx(auVar73,auVar73,0xc9);
                auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
                auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                auVar142._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                auVar142._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                auVar142._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                auVar142._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                auVar71 = vfmsub231ps_fma(auVar142,auVar71,auVar72);
                fVar136 = auVar71._0_4_;
                if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) && (*(long *)(lVar63 + 0x40) == 0))
                {
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar166;
                  fVar166 = (float)vextractps_avx(auVar71,1);
                  pre->ray_space[3].vz.field_0.m128[(long)ray] = fVar166;
                  uVar152 = vextractps_avx(auVar71,2);
                  *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x10) = uVar152;
                  pre[1].ray_space[0].vx.field_0.m128[(long)ray] = fVar136;
                  pre[1].ray_space[0].vy.field_0.m128[(long)ray] = fVar150;
                  pre[1].ray_space[0].vz.field_0.m128[(long)ray] = 0.0;
                  pre[1].ray_space[1].vx.field_0.m128[(long)ray] = fVar242;
                  pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar149;
                  pre[1].ray_space[1].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                  pre[1].ray_space[2].vx.field_0.m128[(long)ray] = *(float *)(*(long *)(k + 8) + 4);
                }
                else {
                  local_460._0_16_ = vshufps_avx(auVar71,auVar71,0x55);
                  local_460._16_16_ = vshufps_avx(auVar71,auVar71,0xaa);
                  local_440 = fVar136;
                  fStack_43c = fVar136;
                  fStack_438 = fVar136;
                  fStack_434 = fVar136;
                  local_430 = fVar150;
                  fStack_42c = fVar150;
                  fStack_428 = fVar150;
                  fStack_424 = fVar150;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = **(undefined4 **)(k + 8);
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = (*(undefined4 **)(k + 8))[1];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar166;
                  local_8b0 = local_490;
                  local_820 = local_8b0;
                  local_818 = *(undefined8 *)(lVar63 + 0x18);
                  local_810 = *(undefined8 *)(k + 8);
                  local_800 = (int *)local_460;
                  local_7f8 = 4;
                  local_840._0_4_ = fVar168;
                  local_808 = pre;
                  if (*(code **)(lVar63 + 0x40) != (code *)0x0) {
                    auVar243 = ZEXT464((uint)fVar170);
                    (**(code **)(lVar63 + 0x40))(&local_820);
                    auVar235 = ZEXT3264(local_7c0);
                    auVar230 = ZEXT3264(local_7a0);
                    auVar225 = ZEXT3264(local_720);
                    auVar228 = ZEXT3264(local_700);
                    auVar239 = ZEXT3264(local_780);
                    auVar245 = ZEXT3264(local_760);
                    auVar244 = ZEXT3264(local_740);
                    fVar168 = (float)local_840._0_4_;
                  }
                  uVar67 = vptestmd_avx512vl(local_8b0,local_8b0);
                  if ((uVar67 & 0xf) != 0) {
                    pcVar7 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                    if ((pcVar7 != (code *)0x0) &&
                       (((**(byte **)(k + 0x10) & 2) != 0 ||
                        ((*(byte *)(lVar63 + 0x3e) & 0x40) != 0)))) {
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      (*pcVar7)(&local_820);
                      auVar235 = ZEXT3264(local_7c0);
                      auVar230 = ZEXT3264(local_7a0);
                      auVar225 = ZEXT3264(local_720);
                      auVar228 = ZEXT3264(local_700);
                      auVar239 = ZEXT3264(local_780);
                      auVar245 = ZEXT3264(local_760);
                      auVar244 = ZEXT3264(local_740);
                      fVar168 = (float)local_840._0_4_;
                    }
                    uVar67 = vptestmd_avx512vl(local_8b0,local_8b0);
                    uVar67 = uVar67 & 0xf;
                    bVar61 = (byte)uVar67;
                    if (bVar61 != 0) {
                      iVar3 = local_800[1];
                      iVar4 = local_800[2];
                      iVar1 = local_800[3];
                      pVVar5 = &local_808->ray_space[3].vz;
                      iVar51 = *(int *)((long)&local_808->ray_space[3].vz.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808->ray_space[3].vz.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808->ray_space[3].vz.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar61 & 1) * *local_800 |
                                  (uint)!(bool)(bVar61 & 1) * *(int *)&pVVar5->field_0);
                      local_808->ray_space[3].vz.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808->ray_space[3].vz.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808->ray_space[3].vz.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      iVar3 = local_800[5];
                      iVar4 = local_800[6];
                      iVar1 = local_800[7];
                      iVar51 = local_808[1].depth_scale.field_0.i[1];
                      iVar52 = local_808[1].depth_scale.field_0.i[2];
                      iVar53 = local_808[1].depth_scale.field_0.i[3];
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      local_808[1].depth_scale.field_0.i[0] =
                           (uint)(bVar61 & 1) * local_800[4] |
                           (uint)!(bool)(bVar61 & 1) * local_808[1].depth_scale.field_0.i[0];
                      local_808[1].depth_scale.field_0.i[1] =
                           (uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51;
                      local_808[1].depth_scale.field_0.i[2] =
                           (uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52;
                      local_808[1].depth_scale.field_0.i[3] =
                           (uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53;
                      iVar3 = local_800[9];
                      iVar4 = local_800[10];
                      iVar1 = local_800[0xb];
                      iVar51 = *(int *)((long)&local_808[1].ray_space[0].vx.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808[1].ray_space[0].vx.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808[1].ray_space[0].vx.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      local_808[1].ray_space[0].vx.field_0.m128[0] =
                           (float)((uint)(bVar61 & 1) * local_800[8] |
                                  (uint)!(bool)(bVar61 & 1) *
                                  *(int *)&local_808[1].ray_space[0].vx.field_0);
                      local_808[1].ray_space[0].vx.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808[1].ray_space[0].vx.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808[1].ray_space[0].vx.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      iVar3 = local_800[0xd];
                      iVar4 = local_800[0xe];
                      iVar1 = local_800[0xf];
                      pVVar5 = &local_808[1].ray_space[0].vy;
                      iVar51 = *(int *)((long)&local_808[1].ray_space[0].vy.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808[1].ray_space[0].vy.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808[1].ray_space[0].vy.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar61 & 1) * local_800[0xc] |
                                  (uint)!(bool)(bVar61 & 1) * *(int *)&pVVar5->field_0);
                      local_808[1].ray_space[0].vy.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808[1].ray_space[0].vy.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808[1].ray_space[0].vy.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      iVar3 = local_800[0x11];
                      iVar4 = local_800[0x12];
                      iVar1 = local_800[0x13];
                      pVVar5 = &local_808[1].ray_space[0].vz;
                      iVar51 = *(int *)((long)&local_808[1].ray_space[0].vz.field_0 + 4);
                      iVar52 = *(int *)((long)&local_808[1].ray_space[0].vz.field_0 + 8);
                      iVar53 = *(int *)((long)&local_808[1].ray_space[0].vz.field_0 + 0xc);
                      bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar9 = SUB81(uVar67 >> 3,0);
                      (pVVar5->field_0).m128[0] =
                           (float)((uint)(bVar61 & 1) * local_800[0x10] |
                                  (uint)!(bool)(bVar61 & 1) * *(int *)&pVVar5->field_0);
                      local_808[1].ray_space[0].vz.field_0.m128[1] =
                           (float)((uint)bVar64 * iVar3 | (uint)!bVar64 * iVar51);
                      local_808[1].ray_space[0].vz.field_0.m128[2] =
                           (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar52);
                      local_808[1].ray_space[0].vz.field_0.m128[3] =
                           (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar53);
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x14));
                      local_808[1].ray_space[1].vx.field_0 = aVar6;
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x18));
                      local_808[1].ray_space[1].vy.field_0 = aVar6;
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x1c));
                      local_808[1].ray_space[1].vz.field_0 = aVar6;
                      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                              vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_800 + 0x20));
                      local_808[1].ray_space[2].vx.field_0 = aVar6;
                      goto LAB_019a072a;
                    }
                  }
                  pre->ray_space[2].vy.field_0.m128[(long)ray] = fVar168;
                }
              }
            }
LAB_019a072a:
            uVar152 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
            auVar218._4_4_ = uVar152;
            auVar218._0_4_ = uVar152;
            auVar218._8_4_ = uVar152;
            auVar218._12_4_ = uVar152;
            auVar218._16_4_ = uVar152;
            auVar218._20_4_ = uVar152;
            auVar218._24_4_ = uVar152;
            auVar218._28_4_ = uVar152;
            auVar212 = ZEXT3264(auVar218);
            auVar55._4_4_ = fStack_31c;
            auVar55._0_4_ = local_320;
            auVar55._8_4_ = fStack_318;
            auVar55._12_4_ = fStack_314;
            auVar55._16_4_ = fStack_310;
            auVar55._20_4_ = fStack_30c;
            auVar55._24_4_ = fStack_308;
            auVar55._28_4_ = fStack_304;
            uVar15 = vcmpps_avx512vl(auVar218,auVar55,0xd);
          }
          uVar17 = vpcmpd_avx512vl(local_2e0,local_280,1);
          uVar16 = vpcmpd_avx512vl(local_2e0,_local_340,1);
          auVar163._0_4_ = (float)local_680._0_4_ + (float)local_200._0_4_;
          auVar163._4_4_ = (float)local_680._4_4_ + (float)local_200._4_4_;
          auVar163._8_4_ = fStack_678 + fStack_1f8;
          auVar163._12_4_ = fStack_674 + fStack_1f4;
          auVar163._16_4_ = fStack_670 + fStack_1f0;
          auVar163._20_4_ = fStack_66c + fStack_1ec;
          auVar163._24_4_ = fStack_668 + fStack_1e8;
          auVar163._28_4_ = fStack_664 + fStack_1e4;
          uVar152 = auVar212._0_4_;
          auVar197._4_4_ = uVar152;
          auVar197._0_4_ = uVar152;
          auVar197._8_4_ = uVar152;
          auVar197._12_4_ = uVar152;
          auVar197._16_4_ = uVar152;
          auVar197._20_4_ = uVar152;
          auVar197._24_4_ = uVar152;
          auVar197._28_4_ = uVar152;
          uVar15 = vcmpps_avx512vl(auVar163,auVar197,2);
          bVar62 = (byte)local_88c & (byte)uVar17 & (byte)uVar15;
          auVar204._0_4_ = (float)local_680._0_4_ + (float)local_2c0._0_4_;
          auVar204._4_4_ = (float)local_680._4_4_ + (float)local_2c0._4_4_;
          auVar204._8_4_ = fStack_678 + fStack_2b8;
          auVar204._12_4_ = fStack_674 + fStack_2b4;
          auVar204._16_4_ = fStack_670 + fStack_2b0;
          auVar204._20_4_ = fStack_66c + fStack_2ac;
          auVar204._24_4_ = fStack_668 + fStack_2a8;
          auVar204._28_4_ = fStack_664 + fStack_2a4;
          uVar15 = vcmpps_avx512vl(auVar204,auVar197,2);
          bVar57 = bVar57 & (byte)uVar16 & (byte)uVar15 | bVar62;
          if (bVar57 != 0) {
            abStack_180[uVar59 * 0x60] = bVar57;
            bVar64 = (bool)(bVar62 >> 1 & 1);
            bVar8 = (bool)(bVar62 >> 2 & 1);
            bVar9 = (bool)(bVar62 >> 3 & 1);
            bVar10 = (bool)(bVar62 >> 4 & 1);
            bVar11 = (bool)(bVar62 >> 5 & 1);
            bVar12 = (bool)(bVar62 >> 6 & 1);
            auStack_160[uVar59 * 0x18] =
                 (uint)(bVar62 & 1) * local_200._0_4_ | (uint)!(bool)(bVar62 & 1) * local_2c0._0_4_;
            auStack_160[uVar59 * 0x18 + 1] =
                 (uint)bVar64 * local_200._4_4_ | (uint)!bVar64 * local_2c0._4_4_;
            auStack_160[uVar59 * 0x18 + 2] =
                 (uint)bVar8 * (int)fStack_1f8 | (uint)!bVar8 * (int)fStack_2b8;
            auStack_160[uVar59 * 0x18 + 3] =
                 (uint)bVar9 * (int)fStack_1f4 | (uint)!bVar9 * (int)fStack_2b4;
            auStack_160[uVar59 * 0x18 + 4] =
                 (uint)bVar10 * (int)fStack_1f0 | (uint)!bVar10 * (int)fStack_2b0;
            auStack_160[uVar59 * 0x18 + 5] =
                 (uint)bVar11 * (int)fStack_1ec | (uint)!bVar11 * (int)fStack_2ac;
            auStack_160[uVar59 * 0x18 + 6] =
                 (uint)bVar12 * (int)fStack_1e8 | (uint)!bVar12 * (int)fStack_2a8;
            auStack_160[uVar59 * 0x18 + 7] =
                 (uint)(bVar62 >> 7) * (int)fStack_1e4 |
                 (uint)!(bool)(bVar62 >> 7) * (int)fStack_2a4;
            uVar67 = vmovlps_avx(local_2f0);
            (&uStack_140)[uVar59 * 0xc] = uVar67;
            aiStack_138[uVar59 * 0x18] = local_894 + 1;
            uVar59 = (ulong)((int)uVar59 + 1);
          }
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar247 = ZEXT3264(auVar93);
          auVar212 = ZEXT3264(_DAT_01f7b040);
          lVar63 = local_7d8;
          context = local_7d0;
          fVar150 = (float)local_680._0_4_;
          fVar166 = (float)local_680._4_4_;
          fVar168 = fStack_678;
          fVar170 = fStack_674;
          fVar136 = fStack_670;
          fVar199 = fStack_66c;
          fVar173 = fStack_668;
          fVar175 = fStack_664;
        }
      }
    }
    do {
      uVar68 = (uint)uVar59;
      uVar59 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        uVar152 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
        auVar34._4_4_ = uVar152;
        auVar34._0_4_ = uVar152;
        auVar34._8_4_ = uVar152;
        auVar34._12_4_ = uVar152;
        auVar34._16_4_ = uVar152;
        auVar34._20_4_ = uVar152;
        auVar34._24_4_ = uVar152;
        auVar34._28_4_ = uVar152;
        uVar15 = vcmpps_avx512vl(local_260,auVar34,2);
        local_7c8 = (ulong)((uint)local_7c8 & (uint)uVar15);
        goto LAB_0199e321;
      }
      auVar93 = *(undefined1 (*) [32])(auStack_160 + uVar59 * 0x18);
      auVar164._0_4_ = fVar150 + auVar93._0_4_;
      auVar164._4_4_ = fVar166 + auVar93._4_4_;
      auVar164._8_4_ = fVar168 + auVar93._8_4_;
      auVar164._12_4_ = fVar170 + auVar93._12_4_;
      auVar164._16_4_ = fVar136 + auVar93._16_4_;
      auVar164._20_4_ = fVar199 + auVar93._20_4_;
      auVar164._24_4_ = fVar173 + auVar93._24_4_;
      auVar164._28_4_ = fVar175 + auVar93._28_4_;
      uVar152 = *(undefined4 *)((long)&pre->ray_space[2].vy.field_0 + (long)ray * 4);
      auVar33._4_4_ = uVar152;
      auVar33._0_4_ = uVar152;
      auVar33._8_4_ = uVar152;
      auVar33._12_4_ = uVar152;
      auVar33._16_4_ = uVar152;
      auVar33._20_4_ = uVar152;
      auVar33._24_4_ = uVar152;
      auVar33._28_4_ = uVar152;
      uVar15 = vcmpps_avx512vl(auVar164,auVar33,2);
      uVar128 = (uint)uVar15 & (uint)abStack_180[uVar59 * 0x60];
    } while (uVar128 == 0);
    uVar67 = (&uStack_140)[uVar59 * 0xc];
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar67;
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar82 = vblendmps_avx512vl(auVar198,auVar93);
    bVar57 = (byte)uVar128;
    auVar127._0_4_ =
         (uint)(bVar57 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar57 & 1) * (int)auVar93._0_4_;
    bVar64 = (bool)((byte)(uVar128 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar64 * auVar82._4_4_ | (uint)!bVar64 * (int)auVar93._4_4_;
    bVar64 = (bool)((byte)(uVar128 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar64 * auVar82._8_4_ | (uint)!bVar64 * (int)auVar93._8_4_;
    bVar64 = (bool)((byte)(uVar128 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar64 * auVar82._12_4_ | (uint)!bVar64 * (int)auVar93._12_4_;
    bVar64 = (bool)((byte)(uVar128 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar64 * auVar82._16_4_ | (uint)!bVar64 * (int)auVar93._16_4_;
    bVar64 = (bool)((byte)(uVar128 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar64 * auVar82._20_4_ | (uint)!bVar64 * (int)auVar93._20_4_;
    bVar64 = (bool)((byte)(uVar128 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar64 * auVar82._24_4_ | (uint)!bVar64 * (int)auVar93._24_4_;
    auVar127._28_4_ =
         (uVar128 >> 7) * auVar82._28_4_ | (uint)!SUB41(uVar128 >> 7,0) * (int)auVar93._28_4_;
    auVar93 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar93 = vminps_avx(auVar127,auVar93);
    auVar82 = vshufpd_avx(auVar93,auVar93,5);
    auVar93 = vminps_avx(auVar93,auVar82);
    auVar82 = vpermpd_avx2(auVar93,0x4e);
    auVar93 = vminps_avx(auVar93,auVar82);
    uVar15 = vcmpps_avx512vl(auVar127,auVar93,0);
    bVar62 = (byte)uVar15 & bVar57;
    if (bVar62 != 0) {
      uVar128 = (uint)bVar62;
    }
    uVar129 = 0;
    for (; (uVar128 & 1) == 0; uVar128 = uVar128 >> 1 | 0x80000000) {
      uVar129 = uVar129 + 1;
    }
    local_894 = aiStack_138[uVar59 * 0x18];
    bVar57 = ~('\x01' << ((byte)uVar129 & 0x1f)) & bVar57;
    abStack_180[uVar59 * 0x60] = bVar57;
    if (bVar57 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar152 = (undefined4)uVar67;
    auVar148._4_4_ = uVar152;
    auVar148._0_4_ = uVar152;
    auVar148._8_4_ = uVar152;
    auVar148._12_4_ = uVar152;
    auVar148._16_4_ = uVar152;
    auVar148._20_4_ = uVar152;
    auVar148._24_4_ = uVar152;
    auVar148._28_4_ = uVar152;
    auVar71 = vmovshdup_avx(auVar161);
    auVar71 = vsubps_avx(auVar71,auVar161);
    auVar165._0_4_ = auVar71._0_4_;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar71 = vfmadd132ps_fma(auVar165,auVar148,auVar212._0_32_);
    local_460 = ZEXT1632(auVar71);
    local_2f0._8_8_ = 0;
    local_2f0._0_8_ = *(ulong *)(local_460 + (ulong)uVar129 * 4);
    uVar59 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }